

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O1

void __thiscall
helics::Federate::registerConnectorInterfacesJsonDetail(Federate *this,JsonBuffer *jsonBuffer)

{
  unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
  *this_00;
  value_t vVar1;
  Core *pCVar2;
  pointer pcVar3;
  char *pcVar4;
  _Head_base<0UL,_helics::PotentialInterfacesManager_*,_false> __ptr;
  string_view inputType_00;
  string_view endpointType;
  string_view outputType_00;
  string_view units_00;
  string_view filterType;
  string_view translatorType;
  _Alloc_hider _Var5;
  bool bVar6;
  bool bVar7;
  FilterTypes opType;
  int iVar8;
  TranslatorTypes ttype;
  iterator iVar9;
  const_reference pvVar10;
  undefined8 extraout_RAX;
  const_iterator cVar11;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *pbVar12;
  anon_class_8_1_552cbcb6 callback;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  const_iterator cVar15;
  _Head_base<0UL,_helics::PotentialInterfacesManager_*,_false> this_01;
  anon_class_8_1_a8116966 callback_00;
  reference pbVar16;
  HelicsException *pHVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  undefined4 uVar20;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  undefined1 uVar21;
  Federate *this_02;
  pointer __p;
  string_view endpoint;
  string_view endpoint_00;
  string_view endpoint_01;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view name;
  string_view message_02;
  string_view message_03;
  string_view fmt;
  string_view message_04;
  string_view name_00;
  string_view message_05;
  string_view message_06;
  string_view message_07;
  string_view message_08;
  string_view fmt_00;
  string_view message_09;
  format_args args;
  format_args args_00;
  iterator __begin4;
  bool ret;
  value_type targets_1;
  string info;
  string outputType;
  string inputType;
  string operation;
  string key;
  const_iterator __end2;
  string units;
  const_iterator __begin2;
  _Alloc_hider in_stack_fffffffffffffc20;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uStack_3d0;
  undefined1 local_3c8 [16];
  _Any_data local_3b8;
  undefined1 auStack_3a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  key_type local_358;
  Federate *local_338;
  undefined4 local_32c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  string local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string local_288;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *local_268;
  string local_260;
  string local_240;
  undefined4 local_21c;
  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  local_218;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *local_1f8;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  key_type local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  const_iterator local_b0;
  data local_90;
  data local_80;
  size_t local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_68;
  size_t local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_58;
  atomic<helics::Federate::Modes> *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_48;
  size_t local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_38;
  
  pbVar12 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             *)jsonBuffer->reference;
  uVar23 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffc28,"defaultglobal","");
  local_268 = pbVar12;
  if ((((data *)&pbVar12->field_0x0)->m_type == object) &&
     (iVar9 = CLI::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
              ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                       **)(pbVar12 + 8),(key_type *)&stack0xfffffffffffffc28),
     (_Rb_tree_header *)iVar9._M_node !=
     &((*(object_t **)(local_268 + 8))->_M_t)._M_impl.super__Rb_tree_header)) {
    pvVar10 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)local_268,(key_type *)&stack0xfffffffffffffc28);
    local_3b8._M_unused._M_member_pointer =
         local_3b8._M_unused._M_member_pointer & 0xffffffffffffff00;
    nlohmann::json_abi_v3_11_3::detail::
    from_json<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              (pvVar10,(boolean_t *)local_3b8._M_pod_data);
    local_32c = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),local_3b8._M_pod_data[0]);
  }
  else {
    local_32c = 0;
  }
  if ((undefined1 *)uVar23 != local_3c8) {
    operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
  }
  pbVar12 = local_268;
  if ((*local_268 ==
       (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        )0x1) &&
     (cVar11 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
               ::_M_find_tr<char[11],void>
                         (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                            **)(local_268 + 8),(char (*) [11])0x418547),
     cVar11._M_node != (_Base_ptr)(*(long *)(pbVar12 + 8) + 8))) {
    pbVar12 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               *)nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>(pbVar12,"interfaces");
  }
  local_338 = this;
  if ((*pbVar12 ==
       (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        )0x1) &&
     (local_1f8 = pbVar12,
     cVar11 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
              ::_M_find_tr<char[8],void>
                        (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                           **)(pbVar12 + 8),(char (*) [8])0x43553e), pbVar12 = local_1f8,
     cVar11._M_node != (_Base_ptr)(*(long *)(local_1f8 + 8) + 8))) {
    pvVar10 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(local_1f8,"filters");
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::cbegin(&local_b0,pvVar10);
    vVar1 = (pvVar10->m_data).m_type;
    local_218.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_218.m_it.array_iterator._M_current = (pointer)0x0;
    local_218.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if (vVar1 == array) {
      local_218.m_it.array_iterator._M_current =
           (((pvVar10->m_data).m_value.array)->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (vVar1 == object) {
      local_218.m_it.object_iterator._M_node =
           &(((pvVar10->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      local_218.m_it.primitive_iterator.m_it = 1;
    }
    local_218.m_object = pvVar10;
    bVar6 = nlohmann::json_abi_v3_11_3::detail::
            iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
            ::
            operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                      (&local_b0,&local_218);
    pbVar12 = local_1f8;
    while (local_1f8 = pbVar12, !bVar6) {
      pbVar12 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 *)nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::operator*(&local_b0);
      uVar23 = local_3c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc28,"name","");
      if ((*pbVar12 ==
           (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            )0x1) &&
         (iVar9 = CLI::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                  ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                           **)(pbVar12 + 8),(key_type *)&stack0xfffffffffffffc28),
         iVar9._M_node != (_Base_ptr)(*(long *)(pbVar12 + 8) + 8))) {
        pvVar10 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)pbVar12,(key_type *)&stack0xfffffffffffffc28);
        if ((pvVar10->m_data).m_type == string) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_240,pvVar10);
        }
        else {
          fileops::generateJsonString(&local_240,pvVar10,true);
        }
      }
      else {
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        local_240._M_string_length = 0;
        local_240.field_2._M_allocated_capacity =
             local_240.field_2._M_allocated_capacity & 0xffffffffffffff00;
      }
      if ((undefined1 *)uVar23 != local_3c8) {
        operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
      }
      uVar23 = local_3c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffc28,"inputType","");
      if ((*pbVar12 ==
           (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            )0x1) &&
         (iVar9 = CLI::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                  ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                           **)(pbVar12 + 8),(key_type *)&stack0xfffffffffffffc28),
         iVar9._M_node != (_Base_ptr)(*(long *)(pbVar12 + 8) + 8))) {
        pvVar10 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)pbVar12,(key_type *)&stack0xfffffffffffffc28);
        if ((pvVar10->m_data).m_type == string) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_288,pvVar10);
        }
        else {
          fileops::generateJsonString(&local_288,pvVar10,true);
        }
      }
      else {
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        local_288._M_string_length = 0;
        local_288.field_2._M_local_buf[0] = '\0';
      }
      if ((undefined1 *)uVar23 != local_3c8) {
        operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
      }
      uVar23 = local_3c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffc28,"outputType","");
      if ((*pbVar12 ==
           (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            )0x1) &&
         (iVar9 = CLI::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                  ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                           **)(pbVar12 + 8),(key_type *)&stack0xfffffffffffffc28),
         iVar9._M_node != (_Base_ptr)(*(long *)(pbVar12 + 8) + 8))) {
        pvVar10 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)pbVar12,(key_type *)&stack0xfffffffffffffc28);
        if ((pvVar10->m_data).m_type == string) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_2e8,pvVar10);
        }
        else {
          fileops::generateJsonString(&local_2e8,pvVar10,true);
        }
      }
      else {
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        local_2e8._M_string_length = 0;
        local_2e8.field_2._M_local_buf[0] = '\0';
      }
      if ((undefined1 *)uVar23 != local_3c8) {
        operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
      }
      uVar23 = local_3c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffc28,"cloning","");
      if ((*pbVar12 ==
           (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            )0x1) &&
         (iVar9 = CLI::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                  ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                           **)(pbVar12 + 8),(key_type *)&stack0xfffffffffffffc28),
         iVar9._M_node != (_Base_ptr)(*(long *)(pbVar12 + 8) + 8))) {
        pvVar10 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)pbVar12,(key_type *)&stack0xfffffffffffffc28);
        local_3b8._M_unused._M_member_pointer =
             local_3b8._M_unused._M_member_pointer & 0xffffffffffffff00;
        nlohmann::json_abi_v3_11_3::detail::
        from_json<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                  (pvVar10,(boolean_t *)local_3b8._M_pod_data);
        uVar20 = (undefined4)CONCAT71((int7)((ulong)&local_b0 >> 8),local_3b8._M_pod_data[0]);
      }
      else {
        uVar20 = 0;
      }
      if ((undefined1 *)uVar23 != local_3c8) {
        operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
      }
      bVar6 = (atomic<helics::Federate::Modes> *)local_2e8._M_string_length !=
              (atomic<helics::Federate::Modes> *)0x0;
      bVar7 = local_288._M_string_length != 0;
      uVar23 = local_3c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffc28,"global","");
      uVar21 = (char)local_32c;
      if (*pbVar12 ==
          (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           )0x1) {
        iVar9 = CLI::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                         **)(pbVar12 + 8),(key_type *)&stack0xfffffffffffffc28);
        uVar21 = (char)local_32c;
        if (iVar9._M_node != (_Base_ptr)(*(long *)(pbVar12 + 8) + 8)) {
          pvVar10 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)pbVar12,(key_type *)&stack0xfffffffffffffc28);
          local_3b8._M_unused._M_member_pointer =
               local_3b8._M_unused._M_member_pointer & 0xffffffffffffff00;
          nlohmann::json_abi_v3_11_3::detail::
          from_json<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    (pvVar10,(boolean_t *)local_3b8._M_pod_data);
          uVar21 = local_3b8._M_pod_data[0];
        }
      }
      if ((undefined1 *)uVar23 != local_3c8) {
        operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
      }
      uVar23 = local_3c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffc28,"operation","");
      local_3b8._M_unused._M_object = auStack_3a8;
      local_21c = uVar20;
      if ((char)uVar20 == '\0') {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"custom","");
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"clone","");
      }
      uVar24 = local_3b8._8_8_;
      uVar22 = local_3b8._M_unused._0_8_;
      if ((*pbVar12 ==
           (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            )0x1) &&
         (iVar9 = CLI::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                  ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                           **)(pbVar12 + 8),(key_type *)&stack0xfffffffffffffc28),
         iVar9._M_node != (_Base_ptr)(*(long *)(pbVar12 + 8) + 8))) {
        pvVar10 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)pbVar12,(key_type *)&stack0xfffffffffffffc28);
        if ((pvVar10->m_data).m_type == string) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_260,pvVar10);
        }
        else {
          fileops::generateJsonString(&local_260,pvVar10,true);
        }
      }
      else {
        local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_260,uVar22,
                   (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    *)(uVar24 + uVar22));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_unused._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_3a8) {
        operator_delete(local_3b8._M_unused._M_object,(ulong)(auStack_3a8._0_8_ + 1));
      }
      paVar19 = &local_358.field_2;
      if ((undefined1 *)uVar23 != local_3c8) {
        operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
      }
      filterType._M_str = (char *)uVar23;
      filterType._M_len = (size_t)in_stack_fffffffffffffc20._M_p;
      opType = filterTypeFromString(filterType);
      bVar6 = checkValidFilterType(local_338,bVar6 || bVar7,opType,&local_260);
      if (bVar6) {
        local_40 = local_288._M_string_length;
        paStack_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_288._M_dataplus._M_p;
        local_50 = (atomic<helics::Federate::Modes> *)local_2e8._M_string_length;
        paStack_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_2e8._M_dataplus._M_p;
        in_R9._4_4_ = 0;
        in_R9._0_4_ = opType;
        inputType_00._M_str = local_288._M_dataplus._M_p;
        inputType_00._M_len = local_288._M_string_length;
        outputType_00._M_str = local_2e8._M_dataplus._M_p;
        outputType_00._M_len = local_2e8._M_string_length;
        name._M_str = local_240._M_dataplus._M_p;
        name._M_len = local_240._M_string_length;
        in_stack_fffffffffffffc20._M_p = local_2e8._M_dataplus._M_p;
        callback.filter =
             generateFilter(local_338,(bool)uVar21,local_21c._0_1_,name,opType,inputType_00,
                            outputType_00);
        local_358.field_2._M_local_buf[4] = 's';
        local_358.field_2._M_allocated_capacity._0_4_ = 0x67616c66;
        local_358._M_string_length = 5;
        local_358.field_2._M_local_buf[5] = '\0';
        local_378._8_8_ = local_338;
        local_378._0_8_ = callback.filter;
        local_358._M_dataplus._M_p = (pointer)paVar19;
        if ((*pbVar12 ==
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              )0x1) &&
           (iVar9 = CLI::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                    ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                             **)(pbVar12 + 8),&local_358),
           iVar9._M_node != (_Base_ptr)(*(long *)(pbVar12 + 8) + 8))) {
          pvVar10 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)pbVar12,&local_358);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_308,pvVar10);
          if (local_308._M_local_buf[0] == '\x02') {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::begin((iterator *)&stack0xfffffffffffffc28,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)&local_308);
            auStack_3a8._8_8_ = (code *)0x8000000000000000;
            auStack_3a8._0_8_ = (code *)0x0;
            local_3b8._8_8_ = (atomic<helics::Federate::Modes> *)0x0;
            local_3b8._M_unused._M_object = &local_308;
            if (local_308._M_local_buf[0] == '\x02') {
              auStack_3a8._0_8_ = *(undefined8 *)(local_308._8_8_ + 8);
            }
            else if (local_308._M_local_buf[0] == '\x01') {
              local_3b8._8_8_ = local_308._8_8_ + 8;
            }
            else {
              auStack_3a8._8_8_ = (code *)0x1;
            }
            while (bVar6 = nlohmann::json_abi_v3_11_3::detail::
                           iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                           ::
                           operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                                     ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                       *)&stack0xfffffffffffffc28,
                                      (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                       *)&local_3b8), !bVar6) {
              pbVar16 = nlohmann::json_abi_v3_11_3::detail::
                        iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                     *)&stack0xfffffffffffffc28);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_398,pbVar16);
              loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_helics::Filter>
              ::anon_class_16_2_14a9c628::operator()
                        ((anon_class_16_2_14a9c628 *)(local_388 + 0x10),(string *)&local_398);
              if ((Filter *)local_398._M_allocated_capacity != (Filter *)local_388) {
                operator_delete((void *)local_398._M_allocated_capacity,(ulong)(local_388._0_8_ + 1)
                               );
              }
              if (*(char *)uVar23 == '\x02') {
                local_3c8._0_8_ = local_3c8._0_8_ + 0x10;
              }
              else if (*(char *)uVar23 == '\x01') {
                uStack_3d0 = std::_Rb_tree_increment((_Rb_tree_node_base *)uStack_3d0);
              }
              else {
                local_3c8._8_8_ = local_3c8._8_8_ + 1;
              }
            }
          }
          else {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((string *)&stack0xfffffffffffffc28,
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_308);
            loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_helics::Filter>
            ::anon_class_16_2_14a9c628::operator()
                      ((anon_class_16_2_14a9c628 *)(local_388 + 0x10),
                       (string *)&stack0xfffffffffffffc28);
            if ((undefined1 *)uVar23 != local_3c8) {
              operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
            }
          }
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&local_308);
        }
        if ((((local_358._M_dataplus._M_p + -1)[local_358._M_string_length] == 's') &&
            (CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             pop_back(&local_358),
            *pbVar12 ==
            (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             )0x1)) &&
           (iVar9 = CLI::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                    ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                             **)(pbVar12 + 8),&local_358),
           iVar9._M_node != (_Base_ptr)(*(long *)(pbVar12 + 8) + 8))) {
          pvVar10 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)pbVar12,&local_358);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((string *)&stack0xfffffffffffffc28,pvVar10);
          loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_helics::Filter>
          ::anon_class_16_2_14a9c628::operator()
                    ((anon_class_16_2_14a9c628 *)(local_388 + 0x10),
                     (string *)&stack0xfffffffffffffc28);
          if ((undefined1 *)uVar23 != local_3c8) {
            operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != paVar19) {
          operator_delete(local_358._M_dataplus._M_p,
                          CONCAT26(local_358.field_2._M_allocated_capacity._6_2_,
                                   CONCAT15(local_358.field_2._M_local_buf[5],
                                            CONCAT14(local_358.field_2._M_local_buf[4],
                                                     local_358.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        local_3c8._8_8_ =
             std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1312:9)>
             ::_M_invoke;
        local_3c8._0_8_ =
             std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1312:9)>
             ::_M_manager;
        local_3b8._M_unused._M_object = (void *)0x0;
        local_3b8._8_8_ = (atomic<helics::Federate::Modes> *)0x0;
        auStack_3a8._8_8_ =
             std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1313:9)>
             ::_M_invoke;
        auStack_3a8._0_8_ =
             std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1313:9)>
             ::_M_manager;
        local_398._8_8_ = 0;
        local_388._8_8_ =
             std::
             _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1314:9)>
             ::_M_invoke;
        local_388._0_8_ =
             std::
             _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1314:9)>
             ::_M_manager;
        local_398._M_allocated_capacity = (size_type)callback.filter;
        processOptions((json *)pbVar12,
                       (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&stack0xfffffffffffffc28,
                       (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_3b8,(function<void_(int,_int)> *)&local_398);
        if ((_func_int **)local_388._0_8_ != (_func_int **)0x0) {
          (*(code *)local_388._0_8_)(&local_398,&local_398,3);
        }
        if ((code *)auStack_3a8._0_8_ != (code *)0x0) {
          (*(code *)auStack_3a8._0_8_)(&local_3b8,&local_3b8,3);
        }
        if ((code *)local_3c8._0_8_ != (code *)0x0) {
          (*(code *)local_3c8._0_8_)
                    ((string *)&stack0xfffffffffffffc28,(string *)&stack0xfffffffffffffc28,3);
        }
        uVar23 = local_3c8;
        local_3c8._0_5_ = 0x6f666e69;
        if ((*pbVar12 ==
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              )0x1) &&
           (iVar9 = CLI::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                    ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                             **)(pbVar12 + 8),(key_type *)&stack0xfffffffffffffc28),
           iVar9._M_node != (_Base_ptr)(*(long *)(pbVar12 + 8) + 8))) {
          pvVar10 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)pbVar12,(key_type *)&stack0xfffffffffffffc28);
          if ((pvVar10->m_data).m_type == string) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_308,pvVar10);
          }
          else {
            fileops::generateJsonString((string *)&local_308,pvVar10,true);
          }
        }
        else {
          local_308._M_allocated_capacity = (size_type)&local_2f8;
          local_308._8_8_ = 0;
          local_2f8._M_local_buf[0] = '\0';
        }
        if ((undefined1 *)uVar23 != local_3c8) {
          operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
        }
        if (local_308._8_8_ != 0) {
          pCVar2 = ((callback.filter)->super_Interface).mCore;
          (*pCVar2->_vptr_Core[0x60])
                    (pCVar2,(ulong)(uint)((callback.filter)->super_Interface).handle.hid);
        }
        local_3c8._8_8_ =
             std::
             _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1320:20)>
             ::_M_invoke;
        local_3c8._0_8_ =
             std::
             _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1320:20)>
             ::_M_manager;
        loadTags((json *)pbVar12,
                 (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                  *)&stack0xfffffffffffffc28);
        if ((code *)local_3c8._0_8_ != (code *)0x0) {
          (*(code *)local_3c8._0_8_)
                    ((string *)&stack0xfffffffffffffc28,(string *)&stack0xfffffffffffffc28,3);
        }
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        local_328.field_2._M_allocated_capacity._4_2_ = 0x6563;
        local_328.field_2._M_allocated_capacity._0_4_ = 0x72756f73;
        local_328._M_string_length = 6;
        local_328.field_2._M_local_buf[6] = '\0';
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        local_2a8.field_2._M_allocated_capacity._0_4_ = 0x67726174;
        local_2a8._M_string_length = 7;
        local_2a8.field_2._M_allocated_capacity._4_4_ = 0x737465;
        local_3b8._M_unused._M_object = auStack_3a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3b8,local_328._M_dataplus._M_p,
                   (undefined1 *)((long)&local_328.field_2 + 6));
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3b8,
                   "_");
        pbVar13 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_3b8,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
        uVar23 = local_3c8;
        pcVar3 = (pbVar13->_M_dataplus)._M_p;
        paVar18 = &pbVar13->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 == paVar18) {
          local_3c8._0_8_ = paVar18->_M_allocated_capacity;
          local_3c8._8_8_ = *(long *)((long)&pbVar13->field_2 + 8);
        }
        else {
          local_3c8._0_8_ = paVar18->_M_allocated_capacity;
          uVar23 = pcVar3;
        }
        (pbVar13->_M_dataplus)._M_p = (pointer)paVar18;
        pbVar13->_M_string_length = 0;
        (pbVar13->field_2)._M_local_buf[0] = '\0';
        bVar6 = addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Filter>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_4_>
                          ((json *)pbVar12,(string *)&stack0xfffffffffffffc28,
                           (anon_class_8_1_a8116966)callback.filter);
        if ((undefined1 *)uVar23 != local_3c8) {
          operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
        }
        if ((undefined1 *)local_3b8._M_unused._0_8_ != auStack_3a8) {
          operator_delete(local_3b8._M_unused._M_object,(ulong)(auStack_3a8._0_8_ + 1));
        }
        if (!bVar6) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_398,&local_328,&local_2a8);
          bVar6 = addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Filter>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_4_>
                            ((json *)pbVar12,(string *)&local_398,
                             (anon_class_8_1_a8116966)callback.filter);
          if ((Filter *)local_398._M_allocated_capacity != (Filter *)local_388) {
            operator_delete((void *)local_398._M_allocated_capacity,(ulong)(local_388._0_8_ + 1));
          }
        }
        _Var5._M_p = local_2a8._M_dataplus._M_p;
        if (bVar6 == false) {
          iVar8 = toupper((int)*local_2a8._M_dataplus._M_p);
          *_Var5._M_p = (char)iVar8;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_388 + 0x10),&local_328,&local_2a8);
          addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Filter>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_4_>
                    ((json *)pbVar12,(string *)(local_388 + 0x10),
                     (anon_class_8_1_a8116966)callback.filter);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._0_8_ != &local_368) {
            operator_delete((void *)local_378._0_8_,local_368._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,
                          CONCAT44(local_2a8.field_2._M_allocated_capacity._4_4_,
                                   local_2a8.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,
                          CONCAT17(local_328.field_2._M_local_buf[7],
                                   CONCAT16(local_328.field_2._M_local_buf[6],
                                            CONCAT24(local_328.field_2._M_allocated_capacity._4_2_,
                                                     local_328.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        local_328.field_2._M_allocated_capacity._0_4_ = 0x74736564;
        local_328.field_2._M_allocated_capacity._4_2_ = 0x6e69;
        local_328.field_2._M_local_buf[6] = 'a';
        local_328.field_2._7_4_ = 0x6e6f6974;
        local_328._M_string_length = 0xb;
        local_328.field_2._M_local_buf[0xb] = '\0';
        local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
        local_2c8.field_2._M_allocated_capacity._0_4_ = 0x67726174;
        local_2c8._M_string_length = 7;
        local_2c8.field_2._M_allocated_capacity._4_4_ = 0x737465;
        local_3b8._M_unused._M_object = auStack_3a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3b8,local_328._M_dataplus._M_p,
                   (undefined1 *)((long)&local_328.field_2 + 0xb));
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3b8,
                   "_");
        pbVar13 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_3b8,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
        uVar23 = local_3c8;
        pcVar3 = (pbVar13->_M_dataplus)._M_p;
        paVar18 = &pbVar13->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 == paVar18) {
          local_3c8._0_8_ = paVar18->_M_allocated_capacity;
          local_3c8._8_8_ = *(long *)((long)&pbVar13->field_2 + 8);
        }
        else {
          local_3c8._0_8_ = paVar18->_M_allocated_capacity;
          uVar23 = pcVar3;
        }
        (pbVar13->_M_dataplus)._M_p = (pointer)paVar18;
        pbVar13->_M_string_length = 0;
        (pbVar13->field_2)._M_local_buf[0] = '\0';
        bVar6 = addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Filter>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_5_>
                          ((json *)pbVar12,(string *)&stack0xfffffffffffffc28,
                           (anon_class_8_1_a8116966)callback.filter);
        if ((undefined1 *)uVar23 != local_3c8) {
          operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
        }
        if ((undefined1 *)local_3b8._M_unused._0_8_ != auStack_3a8) {
          operator_delete(local_3b8._M_unused._M_object,(ulong)(auStack_3a8._0_8_ + 1));
        }
        if (!bVar6) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_398,&local_328,&local_2c8);
          bVar6 = addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Filter>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_5_>
                            ((json *)pbVar12,(string *)&local_398,
                             (anon_class_8_1_a8116966)callback.filter);
          if ((Filter *)local_398._M_allocated_capacity != (Filter *)local_388) {
            operator_delete((void *)local_398._M_allocated_capacity,(ulong)(local_388._0_8_ + 1));
          }
        }
        _Var5._M_p = local_2c8._M_dataplus._M_p;
        if (bVar6 == false) {
          iVar8 = toupper((int)*local_2c8._M_dataplus._M_p);
          *_Var5._M_p = (char)iVar8;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_388 + 0x10),&local_328,&local_2c8);
          addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Filter>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_5_>
                    ((json *)pbVar12,(string *)(local_388 + 0x10),
                     (anon_class_8_1_a8116966)callback.filter);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._0_8_ != &local_368) {
            operator_delete((void *)local_378._0_8_,local_368._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          operator_delete(local_2c8._M_dataplus._M_p,
                          CONCAT44(local_2c8.field_2._M_allocated_capacity._4_4_,
                                   local_2c8.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,
                          CONCAT17(local_328.field_2._M_local_buf[7],
                                   CONCAT16(local_328.field_2._M_local_buf[6],
                                            CONCAT24(local_328.field_2._M_allocated_capacity._4_2_,
                                                     local_328.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_allocated_capacity != &local_2f8) {
          operator_delete((void *)local_308._M_allocated_capacity,
                          CONCAT71(local_2f8._M_allocated_capacity._1_7_,local_2f8._M_local_buf[0])
                          + 1);
        }
        local_358._M_dataplus._M_p = (pointer)paVar19;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"source","");
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"endpoints","");
        local_3b8._M_unused._M_object = auStack_3a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3b8,local_358._M_dataplus._M_p,
                   local_358._M_string_length + local_358._M_dataplus._M_p);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3b8,
                   "_");
        pbVar13 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_3b8,local_d0._M_dataplus._M_p,local_d0._M_string_length);
        uVar23 = local_3c8;
        pcVar3 = (pbVar13->_M_dataplus)._M_p;
        paVar18 = &pbVar13->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 == paVar18) {
          local_3c8._0_8_ = paVar18->_M_allocated_capacity;
          local_3c8._8_8_ = *(long *)((long)&pbVar13->field_2 + 8);
        }
        else {
          local_3c8._0_8_ = paVar18->_M_allocated_capacity;
          uVar23 = pcVar3;
        }
        (pbVar13->_M_dataplus)._M_p = (pointer)paVar18;
        pbVar13->_M_string_length = 0;
        (pbVar13->field_2)._M_local_buf[0] = '\0';
        bVar6 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__3>
                          ((json *)pbVar12,(string *)&stack0xfffffffffffffc28,callback);
        if ((undefined1 *)uVar23 != local_3c8) {
          operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
        }
        if ((undefined1 *)local_3b8._M_unused._0_8_ != auStack_3a8) {
          operator_delete(local_3b8._M_unused._M_object,(ulong)(auStack_3a8._0_8_ + 1));
        }
        if (!bVar6) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_398,&local_358,&local_d0);
          bVar6 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__3>
                            ((json *)pbVar12,(string *)&local_398,callback);
          if ((Filter *)local_398._M_allocated_capacity != (Filter *)local_388) {
            operator_delete((void *)local_398._M_allocated_capacity,(ulong)(local_388._0_8_ + 1));
          }
        }
        _Var5._M_p = local_d0._M_dataplus._M_p;
        if (bVar6 == false) {
          iVar8 = toupper((int)*local_d0._M_dataplus._M_p);
          *_Var5._M_p = (char)iVar8;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_388 + 0x10),&local_358,&local_d0);
          addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__3>
                    ((json *)pbVar12,(string *)(local_388 + 0x10),callback);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._0_8_ != &local_368) {
            operator_delete((void *)local_378._0_8_,local_368._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != paVar19) {
          operator_delete(local_358._M_dataplus._M_p,
                          CONCAT26(local_358.field_2._M_allocated_capacity._6_2_,
                                   CONCAT15(local_358.field_2._M_local_buf[5],
                                            CONCAT14(local_358.field_2._M_local_buf[4],
                                                     local_358.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        local_358._M_dataplus._M_p = (pointer)paVar19;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"destination","");
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"endpoints","");
        local_3b8._M_unused._M_object = auStack_3a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3b8,local_358._M_dataplus._M_p,
                   local_358._M_string_length + local_358._M_dataplus._M_p);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3b8,
                   "_");
        pbVar13 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_3b8,local_f0._M_dataplus._M_p,local_f0._M_string_length);
        uVar23 = local_3c8;
        pcVar4 = (pbVar13->_M_dataplus)._M_p;
        paVar18 = &pbVar13->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 == paVar18) {
          local_3c8._0_8_ = paVar18->_M_allocated_capacity;
          local_3c8._8_8_ = *(long *)((long)&pbVar13->field_2 + 8);
        }
        else {
          local_3c8._0_8_ = paVar18->_M_allocated_capacity;
          uVar23 = pcVar4;
        }
        uStack_3d0 = pbVar13->_M_string_length;
        (pbVar13->_M_dataplus)._M_p = (pointer)paVar18;
        pbVar13->_M_string_length = 0;
        (pbVar13->field_2)._M_local_buf[0] = '\0';
        bVar6 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__4>
                          ((json *)pbVar12,(string *)&stack0xfffffffffffffc28,callback);
        if ((undefined1 *)uVar23 != local_3c8) {
          operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_unused._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)auStack_3a8) {
          operator_delete(local_3b8._M_unused._M_object,(ulong)(auStack_3a8._0_8_ + 1));
        }
        if (!bVar6) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_398,&local_358,&local_f0);
          bVar6 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__4>
                            ((json *)pbVar12,(string *)&local_398,callback);
          if ((Filter *)local_398._M_allocated_capacity != (Filter *)local_388) {
            operator_delete((void *)local_398._M_allocated_capacity,(ulong)(local_388._0_8_ + 1));
          }
        }
        _Var5._M_p = local_f0._M_dataplus._M_p;
        if (bVar6 == false) {
          iVar8 = toupper((int)*local_f0._M_dataplus._M_p);
          *_Var5._M_p = (char)iVar8;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_388 + 0x10),&local_358,&local_f0);
          addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__4>
                    ((json *)pbVar12,(string *)(local_388 + 0x10),callback);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._0_8_ != &local_368) {
            operator_delete((void *)local_378._0_8_,local_368._M_allocated_capacity + 1);
          }
        }
        uVar20 = local_21c;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != paVar19) {
          operator_delete(local_358._M_dataplus._M_p,
                          CONCAT26(local_358.field_2._M_allocated_capacity._6_2_,
                                   CONCAT15(local_358.field_2._M_local_buf[5],
                                            CONCAT14(local_358.field_2._M_local_buf[4],
                                                     local_358.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
        if ((char)uVar20 != '\0') {
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"delivery","");
          if ((*pbVar12 ==
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                )0x1) &&
             (iVar9 = CLI::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                      ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                               **)(pbVar12 + 8),&local_110),
             iVar9._M_node != (_Base_ptr)(*(long *)(pbVar12 + 8) + 8))) {
            pvVar10 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)pbVar12,&local_110);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)(local_388 + 0x10),pvVar10);
            if (local_378[0] == '\x02') {
              paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_388 + 0x10);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::begin((iterator *)&stack0xfffffffffffffc28,
                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)paVar14);
              auStack_3a8._8_8_ = (code *)0x8000000000000000;
              auStack_3a8._0_8_ = (code *)0x0;
              local_3b8._8_8_ = (atomic<helics::Federate::Modes> *)0x0;
              local_3b8._M_unused._0_8_ = paVar14;
              if (local_378[0] == '\x02') {
                auStack_3a8._0_8_ =
                     *(undefined8 *)
                      &((atomic<helics::Federate::Modes> *)(local_378._8_8_ + 8))->_M_i;
              }
              else if (local_378[0] == '\x01') {
                local_3b8._8_8_ = local_378._8_8_ + 8;
              }
              else {
                auStack_3a8._8_8_ = (code *)0x1;
              }
              while (bVar6 = nlohmann::json_abi_v3_11_3::detail::
                             iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             ::
                             operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                                       ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                         *)&stack0xfffffffffffffc28,
                                        (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                         *)&local_3b8), !bVar6) {
                pbVar16 = nlohmann::json_abi_v3_11_3::detail::
                          iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                       *)&stack0xfffffffffffffc28);
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::
                get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (&local_398,pbVar16);
                endpoint_00._M_str = (char *)local_398._M_allocated_capacity;
                endpoint_00._M_len = local_398._8_8_;
                CloningFilter::addDeliveryEndpoint((CloningFilter *)callback.filter,endpoint_00);
                if ((Filter *)local_398._M_allocated_capacity != (Filter *)local_388) {
                  operator_delete((void *)local_398._M_allocated_capacity,
                                  (ulong)(local_388._0_8_ + 1));
                }
                if (*(char *)uVar23 == '\x02') {
                  local_3c8._0_8_ = local_3c8._0_8_ + 0x10;
                }
                else if (*(char *)uVar23 == '\x01') {
                  uStack_3d0 = std::_Rb_tree_increment((_Rb_tree_node_base *)uStack_3d0);
                }
                else {
                  local_3c8._8_8_ = local_3c8._8_8_ + 1;
                }
              }
            }
            else {
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((string *)&stack0xfffffffffffffc28,
                         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)(local_388 + 0x10));
              endpoint._M_str = (char *)uVar23;
              endpoint._M_len = uStack_3d0;
              CloningFilter::addDeliveryEndpoint((CloningFilter *)callback.filter,endpoint);
              if ((undefined1 *)uVar23 != local_3c8) {
                operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
              }
            }
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data((data *)(local_388 + 0x10));
          }
          if (((local_110._M_dataplus._M_p[local_110._M_string_length - 1] == 's') &&
              (CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::pop_back(&local_110),
              *pbVar12 ==
              (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               )0x1)) &&
             (iVar9 = CLI::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                      ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                               **)(pbVar12 + 8),&local_110),
             iVar9._M_node != (_Base_ptr)(*(long *)(pbVar12 + 8) + 8))) {
            pvVar10 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)pbVar12,&local_110);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((string *)&stack0xfffffffffffffc28,pvVar10);
            endpoint_01._M_str = (char *)uVar23;
            endpoint_01._M_len = uStack_3d0;
            CloningFilter::addDeliveryEndpoint((CloningFilter *)callback.filter,endpoint_01);
            if ((undefined1 *)uVar23 != local_3c8) {
              operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
        }
        if (*pbVar12 ==
            (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             )0x1) {
          bVar6 = local_338->strictConfigChecking;
          cVar11 = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                   ::_M_find_tr<char[11],void>
                             (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                **)(pbVar12 + 8),(char (*) [11])"properties");
          if (cVar11._M_node != (_Base_ptr)(*(long *)(pbVar12 + 8) + 8)) {
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)nlohmann::json_abi_v3_11_3::
                         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         ::operator[]<char_const>(pbVar12,"properties");
            if ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 )paVar14->_M_local_buf[0] ==
                (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 )0x1) {
              cVar11 = std::
                       _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                       ::_M_find_tr<char[5],void>
                                 (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                    **)(paVar14->_M_local_buf + 8),(char (*) [5])0x42591b);
              if (((cVar11._M_node ==
                    (_Base_ptr)
                    (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                       **)(paVar14->_M_local_buf + 8) + 8)) ||
                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    )paVar14->_M_local_buf[0] !=
                   (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    )0x1)) ||
                 (cVar11 = std::
                           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                           ::_M_find_tr<char[6],void>
                                     (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                        **)(paVar14->_M_local_buf + 8),(char (*) [6])0x43c869),
                 cVar11._M_node == (_Base_ptr)(*(long *)(paVar14->_M_local_buf + 8) + 8)))
              goto LAB_0023033d;
              pvVar10 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                    *)paVar14->_M_local_buf,"value");
              if ((byte)((pvVar10->m_data).m_type - number_integer) < 3) {
                pvVar10 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                      *)paVar14->_M_local_buf,"name");
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::
                get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (&stack0xfffffffffffffc28,pvVar10);
                uVar22 = uVar23;
                pvVar10 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                      *)paVar14->_M_local_buf,"value");
                local_3b8._M_unused._M_object =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
                nlohmann::json_abi_v3_11_3::detail::
                get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_double,_0>
                          (pvVar10,(double *)&local_3b8);
                (*((callback.filter)->super_Interface)._vptr_Interface[5])
                          ((int)local_3b8._M_unused._M_member_pointer,callback.filter,uStack_3d0,
                           uVar23);
                if ((undefined1 *)uVar22 != local_3c8) {
LAB_00230697:
                  operator_delete((void *)uVar22,local_3c8._0_8_ + 1);
                }
              }
              else {
                pvVar10 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                      *)paVar14->_M_local_buf,"name");
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::
                get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (&stack0xfffffffffffffc28,pvVar10);
                uVar22 = uVar23;
                pvVar10 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                      *)paVar14->_M_local_buf,"value");
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::
                get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (&local_3b8,pvVar10);
                (*((callback.filter)->super_Interface)._vptr_Interface[6])
                          (callback.filter,uStack_3d0,uVar23,local_3b8._8_8_,
                           local_3b8._M_unused._M_object);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3b8._M_unused._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)auStack_3a8) {
                  operator_delete(local_3b8._M_unused._M_object,(ulong)(auStack_3a8._0_8_ + 1));
                }
                if ((undefined1 *)uVar22 != local_3c8) goto LAB_00230697;
              }
            }
            else if ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      )paVar14->_M_local_buf[0] ==
                     (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      )0x2) {
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::cbegin((const_iterator *)&stack0xfffffffffffffc28,
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)paVar14);
              auStack_3a8._8_8_ = (code *)0x8000000000000000;
              auStack_3a8._0_8_ = (code *)0x0;
              local_3b8._8_8_ = (atomic<helics::Federate::Modes> *)0x0;
              if ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   )paVar14->_M_local_buf[0] ==
                  (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   )0x2) {
                auStack_3a8._0_8_ = *(long *)(*(long *)(paVar14->_M_local_buf + 8) + 8);
              }
              else if ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        )paVar14->_M_local_buf[0] ==
                       (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        )0x1) {
                local_3b8._8_8_ = *(long *)(paVar14->_M_local_buf + 8) + 8;
              }
              else {
                auStack_3a8._8_8_ = (code *)0x1;
              }
              local_3b8._M_unused._0_8_ = (undefined8)paVar14;
              bVar7 = nlohmann::json_abi_v3_11_3::detail::
                      iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                      ::
                      operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                                ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                  *)&stack0xfffffffffffffc28,
                                 (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                  *)&local_3b8);
              this_02 = local_338;
              while (!bVar7) {
                pbVar12 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)nlohmann::json_abi_v3_11_3::detail::
                             iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                          *)&stack0xfffffffffffffc28);
                if (*pbVar12 ==
                    (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     )0x1) {
                  cVar11 = std::
                           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                           ::_M_find_tr<char[5],void>
                                     (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                        **)(pbVar12 + 8),(char (*) [5])0x42591b);
                  if (((cVar11._M_node ==
                        (_Base_ptr)
                        (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                           **)(pbVar12 + 8) + 8)) ||
                      (*pbVar12 !=
                       (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        )0x1)) ||
                     (cVar11 = std::
                               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                               ::_M_find_tr<char[6],void>
                                         (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                            **)(pbVar12 + 8),(char (*) [6])0x43c869),
                     cVar11._M_node == (_Base_ptr)(*(long *)(pbVar12 + 8) + 8))) goto LAB_002304ed;
                  pvVar10 = nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            ::operator[]<char_const>(pbVar12,"value");
                  if ((byte)((pvVar10->m_data).m_type - number_integer) < 3) {
                    pvVar10 = nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              ::operator[]<char_const>(pbVar12,"name");
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::
                    get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                              (&local_398,pvVar10);
                    uVar24 = local_398._8_8_;
                    uVar22 = local_398._M_allocated_capacity;
                    pvVar10 = nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              ::operator[]<char_const>(pbVar12,"value");
                    local_378._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
                    nlohmann::json_abi_v3_11_3::detail::
                    get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_double,_0>
                              (pvVar10,(double *)(local_388 + 0x10));
                    (*((callback.filter)->super_Interface)._vptr_Interface[5])
                              ((int)local_378._0_8_,callback.filter,uVar24,uVar22);
                    if ((Filter *)local_398._M_allocated_capacity != (Filter *)local_388) {
                      operator_delete((void *)local_398._M_allocated_capacity,
                                      (ulong)(local_388._0_8_ + 1));
                    }
                  }
                  else {
                    pvVar10 = nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              ::operator[]<char_const>(pbVar12,"name");
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::
                    get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                              (&local_398,pvVar10);
                    uVar24 = local_398._8_8_;
                    uVar22 = local_398._M_allocated_capacity;
                    pvVar10 = nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              ::operator[]<char_const>(pbVar12,"value");
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::
                    get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                              (local_388 + 0x10,pvVar10);
                    (*((callback.filter)->super_Interface)._vptr_Interface[6])
                              (callback.filter,uVar24,uVar22,local_378._8_8_,local_378._0_8_);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_378._0_8_ != &local_368) {
                      operator_delete((void *)local_378._0_8_,local_368._M_allocated_capacity + 1);
                    }
                    if ((Filter *)local_398._M_allocated_capacity != (Filter *)local_388) {
                      operator_delete((void *)local_398._M_allocated_capacity,
                                      (ulong)(local_388._0_8_ + 1));
                    }
                  }
                }
                else {
LAB_002304ed:
                  if (bVar6 != false) goto LAB_00232c99;
                  message_03._M_str = "interface properties require \"name\" and \"value\" fields";
                  message_03._M_len = 0x36;
                  logMessage(this_02,3,message_03);
                }
                if (*(char *)uVar23 == '\x02') {
                  local_3c8._0_8_ = local_3c8._0_8_ + 0x10;
                }
                else if (*(char *)uVar23 == '\x01') {
                  uStack_3d0 = std::_Rb_tree_increment((_Rb_tree_node_base *)uStack_3d0);
                }
                else {
                  local_3c8._8_8_ = local_3c8._8_8_ + 1;
                }
                bVar7 = nlohmann::json_abi_v3_11_3::detail::
                        iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        ::
                        operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                                  ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                    *)&stack0xfffffffffffffc28,
                                   (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                    *)&local_3b8);
              }
            }
            else {
LAB_0023033d:
              this_02 = local_338;
              if (bVar6 != false) {
LAB_00232c99:
                message_07._M_str = "interface properties require \"name\" and \"value\" fields";
                message_07._M_len = 0x36;
                logMessage(this_02,0,message_07);
                pHVar17 = (HelicsException *)__cxa_allocate_exception(0x28);
                message._M_str = "interface properties require \"name\" and \"value\" fields";
                message._M_len = 0x36;
                HelicsException::HelicsException(pHVar17,message);
                *(undefined ***)pHVar17 = &PTR__HelicsException_00522bc0;
                __cxa_throw(pHVar17,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
              }
              message_02._M_str = "interface properties require \"name\" and \"value\" fields";
              message_02._M_len = 0x36;
              logMessage(local_338,3,message_02);
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,
                        CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                 local_260.field_2._M_local_buf[0]) + 1);
      }
      this = local_338;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,
                        CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                                 local_2e8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,
                        CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                 local_288.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,
                        (ulong)(local_240.field_2._M_allocated_capacity + 1));
      }
      vVar1 = ((local_b0.m_object)->m_data).m_type;
      if (vVar1 == array) {
        local_b0.m_it.array_iterator._M_current = local_b0.m_it.array_iterator._M_current + 1;
      }
      else if (vVar1 == object) {
        local_b0.m_it.object_iterator._M_node =
             (_Base_ptr)std::_Rb_tree_increment(local_b0.m_it.object_iterator._M_node);
      }
      else {
        local_b0.m_it.primitive_iterator.m_it = local_b0.m_it.primitive_iterator.m_it + 1;
      }
      bVar6 = nlohmann::json_abi_v3_11_3::detail::
              iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              ::
              operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                        (&local_b0,&local_218);
      pbVar12 = local_1f8;
    }
  }
  if ((*pbVar12 ==
       (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        )0x1) &&
     (cVar11 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
               ::_M_find_tr<char[12],void>
                         (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                            **)(pbVar12 + 8),(char (*) [12])0x4308e5),
     cVar11._M_node != (_Base_ptr)(*(long *)(pbVar12 + 8) + 8))) {
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>(pbVar12,"translators");
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::cbegin(&local_218,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)paVar14);
    local_240.field_2._8_8_ = 0x8000000000000000;
    local_240.field_2._M_allocated_capacity = 0;
    local_240._M_string_length = 0;
    if (paVar14->_M_local_buf[0] == '\x02') {
      local_240.field_2._M_allocated_capacity =
           (size_type)
           (((json_value *)((long)paVar14 + 8))->array->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (paVar14->_M_local_buf[0] == '\x01') {
      local_240._M_string_length =
           (size_type)
           &(((json_value *)((long)paVar14 + 8))->object->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      local_240.field_2._8_8_ = 1;
    }
    local_240._M_dataplus._M_p = (pointer)paVar14;
    bVar6 = nlohmann::json_abi_v3_11_3::detail::
            iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
            ::
            operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                      (&local_218,
                       (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        *)&local_240);
    if (!bVar6) {
      do {
        pbVar12 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   *)nlohmann::json_abi_v3_11_3::detail::
                     iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                     ::operator*(&local_218);
        uVar23 = local_3c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffffc28,"name","");
        if ((*pbVar12 ==
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              )0x1) &&
           (iVar9 = CLI::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                    ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                             **)(pbVar12 + 8),(key_type *)&stack0xfffffffffffffc28),
           iVar9._M_node != (_Base_ptr)(*(long *)(pbVar12 + 8) + 8))) {
          pvVar10 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)pbVar12,(key_type *)&stack0xfffffffffffffc28);
          if ((pvVar10->m_data).m_type == string) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_288,pvVar10);
          }
          else {
            fileops::generateJsonString(&local_288,pvVar10,true);
          }
        }
        else {
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          local_288._M_string_length = 0;
          local_288.field_2._M_local_buf[0] = '\0';
        }
        if ((undefined1 *)uVar23 != local_3c8) {
          operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
        }
        uVar24 = local_3c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffffc28,"type","");
        local_3b8._M_unused._M_object = auStack_3a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"custom","");
        uVar22 = local_3b8._8_8_;
        uVar23 = local_3b8._M_unused._0_8_;
        if ((*pbVar12 ==
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              )0x1) &&
           (iVar9 = CLI::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                    ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                             **)(pbVar12 + 8),(key_type *)&stack0xfffffffffffffc28),
           iVar9._M_node != (_Base_ptr)(*(long *)(pbVar12 + 8) + 8))) {
          pvVar10 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)pbVar12,(key_type *)&stack0xfffffffffffffc28);
          if ((pvVar10->m_data).m_type == string) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_2e8,pvVar10);
          }
          else {
            fileops::generateJsonString(&local_2e8,pvVar10,true);
          }
        }
        else {
          local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2e8,uVar23,
                     (atomic<helics::Federate::Modes> *)(uVar22 + uVar23));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_unused._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)auStack_3a8) {
          operator_delete(local_3b8._M_unused._M_object,(ulong)(auStack_3a8._0_8_ + 1));
        }
        if ((undefined1 *)uVar24 != local_3c8) {
          operator_delete((void *)uVar24,local_3c8._0_8_ + 1);
        }
        translatorType._M_str = (char *)uVar24;
        translatorType._M_len = (size_t)in_stack_fffffffffffffc20._M_p;
        ttype = translatorTypeFromString(translatorType);
        uVar23 = local_3c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffffc28,"endpointtype","");
        if ((*pbVar12 ==
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              )0x1) &&
           (iVar9 = CLI::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                    ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                             **)(pbVar12 + 8),(key_type *)&stack0xfffffffffffffc28),
           iVar9._M_node != (_Base_ptr)(*(long *)(pbVar12 + 8) + 8))) {
          pvVar10 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)pbVar12,(key_type *)&stack0xfffffffffffffc28);
          if ((pvVar10->m_data).m_type == string) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_260,pvVar10);
          }
          else {
            fileops::generateJsonString(&local_260,pvVar10,true);
          }
        }
        else {
          local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
          local_260._M_string_length = 0;
          local_260.field_2._M_local_buf[0] = '\0';
        }
        if ((undefined1 *)uVar23 != local_3c8) {
          operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
        }
        uVar23 = local_3c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffffc28,"unit","");
        if ((*pbVar12 ==
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              )0x1) &&
           (iVar9 = CLI::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                    ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                             **)(pbVar12 + 8),(key_type *)&stack0xfffffffffffffc28),
           iVar9._M_node != (_Base_ptr)(*(long *)(pbVar12 + 8) + 8))) {
          pvVar10 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)pbVar12,(key_type *)&stack0xfffffffffffffc28);
          if ((pvVar10->m_data).m_type == string) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_1f0,pvVar10);
          }
          else {
            fileops::generateJsonString(&local_1f0,pvVar10,true);
          }
        }
        else {
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          local_1f0._M_string_length = 0;
          local_1f0.field_2._M_local_buf[0] = '\0';
        }
        if ((undefined1 *)uVar23 != local_3c8) {
          operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
        }
        uVar23 = local_3c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffffc28,"units","");
        if ((*pbVar12 ==
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              )0x1) &&
           (iVar9 = CLI::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                    ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                             **)(pbVar12 + 8),(key_type *)&stack0xfffffffffffffc28),
           iVar9._M_node != (_Base_ptr)(*(long *)(pbVar12 + 8) + 8))) {
          pvVar10 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)pbVar12,(key_type *)&stack0xfffffffffffffc28);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_b0,pvVar10);
          registerConnectorInterfacesJsonDetail();
        }
        if ((undefined1 *)uVar23 != local_3c8) {
          operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
        }
        uVar23 = local_3c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffffc28,"global","");
        uVar21 = (char)local_32c;
        if (*pbVar12 ==
            (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             )0x1) {
          iVar9 = CLI::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                  ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                           **)(pbVar12 + 8),(key_type *)&stack0xfffffffffffffc28);
          uVar21 = (char)local_32c;
          if (iVar9._M_node != (_Base_ptr)(*(long *)(pbVar12 + 8) + 8)) {
            pvVar10 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)pbVar12,(key_type *)&stack0xfffffffffffffc28);
            local_3b8._M_unused._M_member_pointer =
                 local_3b8._M_unused._M_member_pointer & 0xffffffffffffff00;
            nlohmann::json_abi_v3_11_3::detail::
            from_json<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                      (pvVar10,(boolean_t *)local_3b8._M_pod_data);
            uVar21 = local_3b8._M_pod_data[0];
          }
        }
        if ((undefined1 *)uVar23 != local_3c8) {
          operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
        }
        if (ttype == UNRECOGNIZED) {
          if (this->strictConfigChecking == true) {
            local_3b8._M_unused._M_object = local_2e8._M_dataplus._M_p;
            local_3b8._8_8_ = local_2e8._M_string_length;
            fmt_00.size_ = 0xd;
            fmt_00.data_ = (char *)0x1f;
            args_00.field_1.values_ = in_R9.values_;
            args_00.desc_ = (unsigned_long_long)&local_3b8;
            ::fmt::v11::vformat_abi_cxx11_
                      ((string *)&stack0xfffffffffffffc28,(v11 *)"unrecognized translator type:{}",
                       fmt_00,args_00);
            message_09._M_str = (char *)uVar23;
            message_09._M_len = uStack_3d0;
            logMessage(local_338,0,message_09);
            pHVar17 = (HelicsException *)__cxa_allocate_exception(0x28);
            message_01._M_str = (char *)uVar23;
            message_01._M_len = uStack_3d0;
            HelicsException::HelicsException(pHVar17,message_01);
            *(undefined ***)pHVar17 = &PTR__HelicsException_00522bc0;
            __cxa_throw(pHVar17,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
          }
          local_3b8._M_unused._M_object = local_2e8._M_dataplus._M_p;
          local_3b8._8_8_ = local_2e8._M_string_length;
          fmt.size_ = 0xd;
          fmt.data_ = (char *)0x24;
          args.field_1.values_ = in_R9.values_;
          args.desc_ = (unsigned_long_long)&local_3b8;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)&stack0xfffffffffffffc28,
                     (v11 *)"unrecognized translator operation:{}",fmt,args);
          message_04._M_str = (char *)uVar23;
          message_04._M_len = uStack_3d0;
          logMessage(this,3,message_04);
LAB_00230f75:
          if ((undefined1 *)uVar23 != local_3c8) {
            operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
          }
        }
        else {
          local_60 = local_260._M_string_length;
          paStack_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_260._M_dataplus._M_p;
          local_70 = local_1f0._M_string_length;
          paStack_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_1f0._M_dataplus._M_p;
          endpointType._M_str = local_260._M_dataplus._M_p;
          endpointType._M_len = local_260._M_string_length;
          units_00._M_str = local_1f0._M_dataplus._M_p;
          units_00._M_len = local_1f0._M_string_length;
          name_00._M_str = local_288._M_dataplus._M_p;
          name_00._M_len = local_288._M_string_length;
          in_stack_fffffffffffffc20._M_p = local_1f0._M_dataplus._M_p;
          callback_00.iface =
               generateTranslator(this,(bool)uVar21,name_00,ttype,endpointType,units_00);
          local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
          local_358.field_2._M_local_buf[4] = 's';
          local_358.field_2._M_allocated_capacity._0_4_ = 0x67616c66;
          local_358._M_string_length = 5;
          local_358.field_2._M_local_buf[5] = '\0';
          local_378._8_8_ = local_338;
          local_378._0_8_ = callback_00.iface;
          if ((*pbVar12 ==
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                )0x1) &&
             (iVar9 = CLI::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                      ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                               **)(pbVar12 + 8),&local_358),
             iVar9._M_node != (_Base_ptr)(*(long *)(pbVar12 + 8) + 8))) {
            pvVar10 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)pbVar12,&local_358);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_308,pvVar10);
            if (local_308._M_local_buf[0] == '\x02') {
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::begin((iterator *)&stack0xfffffffffffffc28,
                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)&local_308);
              auStack_3a8._8_8_ = (code *)0x8000000000000000;
              auStack_3a8._0_8_ = (code *)0x0;
              local_3b8._8_8_ = (atomic<helics::Federate::Modes> *)0x0;
              local_3b8._M_unused._M_object = &local_308;
              if (local_308._M_local_buf[0] == '\x02') {
                auStack_3a8._0_8_ = *(undefined8 *)(local_308._8_8_ + 8);
              }
              else if (local_308._M_local_buf[0] == '\x01') {
                local_3b8._8_8_ = local_308._8_8_ + 8;
              }
              else {
                auStack_3a8._8_8_ = (code *)0x1;
              }
              while (bVar6 = nlohmann::json_abi_v3_11_3::detail::
                             iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             ::
                             operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                                       ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                         *)&stack0xfffffffffffffc28,
                                        (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                         *)&local_3b8), !bVar6) {
                pbVar16 = nlohmann::json_abi_v3_11_3::detail::
                          iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                       *)&stack0xfffffffffffffc28);
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::
                get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (&local_398,pbVar16);
                loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_helics::Translator>
                ::anon_class_16_2_14a9c628::operator()
                          ((anon_class_16_2_14a9c628 *)(local_388 + 0x10),(string *)&local_398);
                if ((Filter *)local_398._M_allocated_capacity != (Filter *)local_388) {
                  operator_delete((void *)local_398._M_allocated_capacity,
                                  (ulong)(local_388._0_8_ + 1));
                }
                if (*(char *)uVar23 == '\x02') {
                  local_3c8._0_8_ = local_3c8._0_8_ + 0x10;
                }
                else if (*(char *)uVar23 == '\x01') {
                  uStack_3d0 = std::_Rb_tree_increment((_Rb_tree_node_base *)uStack_3d0);
                }
                else {
                  local_3c8._8_8_ = local_3c8._8_8_ + 1;
                }
              }
            }
            else {
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((string *)&stack0xfffffffffffffc28,
                         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_308);
              loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_helics::Translator>
              ::anon_class_16_2_14a9c628::operator()
                        ((anon_class_16_2_14a9c628 *)(local_388 + 0x10),
                         (string *)&stack0xfffffffffffffc28);
              if ((undefined1 *)uVar23 != local_3c8) {
                operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
              }
            }
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data((data *)&local_308);
          }
          if ((((local_358._M_dataplus._M_p + -1)[local_358._M_string_length] == 's') &&
              (CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::pop_back(&local_358),
              *pbVar12 ==
              (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               )0x1)) &&
             (iVar9 = CLI::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                      ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                               **)(pbVar12 + 8),&local_358),
             iVar9._M_node != (_Base_ptr)(*(long *)(pbVar12 + 8) + 8))) {
            pvVar10 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)pbVar12,&local_358);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((string *)&stack0xfffffffffffffc28,pvVar10);
            loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_helics::Translator>
            ::anon_class_16_2_14a9c628::operator()
                      ((anon_class_16_2_14a9c628 *)(local_388 + 0x10),
                       (string *)&stack0xfffffffffffffc28);
            if ((undefined1 *)uVar23 != local_3c8) {
              operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_dataplus._M_p != &local_358.field_2) {
            operator_delete(local_358._M_dataplus._M_p,
                            CONCAT26(local_358.field_2._M_allocated_capacity._6_2_,
                                     CONCAT15(local_358.field_2._M_local_buf[5],
                                              CONCAT14(local_358.field_2._M_local_buf[4],
                                                       local_358.field_2._M_allocated_capacity._0_4_
                                                      ))) + 1);
          }
          local_3c8._8_8_ =
               std::
               _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1312:9)>
               ::_M_invoke;
          local_3c8._0_8_ =
               std::
               _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1312:9)>
               ::_M_manager;
          local_3b8._M_unused._M_object = (void *)0x0;
          local_3b8._8_8_ = (atomic<helics::Federate::Modes> *)0x0;
          auStack_3a8._8_8_ =
               std::
               _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1313:9)>
               ::_M_invoke;
          auStack_3a8._0_8_ =
               std::
               _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1313:9)>
               ::_M_manager;
          local_398._8_8_ = 0;
          local_388._8_8_ =
               std::
               _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1314:9)>
               ::_M_invoke;
          local_388._0_8_ =
               std::
               _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1314:9)>
               ::_M_manager;
          local_398._M_allocated_capacity = (size_type)callback_00.iface;
          processOptions((json *)pbVar12,
                         (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&stack0xfffffffffffffc28,
                         (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&local_3b8,(function<void_(int,_int)> *)&local_398);
          if ((_func_int **)local_388._0_8_ != (_func_int **)0x0) {
            (*(code *)local_388._0_8_)(&local_398,&local_398,3);
          }
          if ((code *)auStack_3a8._0_8_ != (code *)0x0) {
            (*(code *)auStack_3a8._0_8_)(&local_3b8,&local_3b8,3);
          }
          if ((code *)local_3c8._0_8_ != (code *)0x0) {
            (*(code *)local_3c8._0_8_)
                      ((string *)&stack0xfffffffffffffc28,(string *)&stack0xfffffffffffffc28,3);
          }
          local_3c8._0_5_ = 0x6f666e69;
          uVar23 = local_3c8;
          if ((*pbVar12 ==
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                )0x1) &&
             (iVar9 = CLI::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                      ::find(*(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
                               **)(pbVar12 + 8),(key_type *)&stack0xfffffffffffffc28),
             iVar9._M_node != (_Base_ptr)(*(long *)(pbVar12 + 8) + 8))) {
            pvVar10 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)pbVar12,(key_type *)&stack0xfffffffffffffc28);
            if ((pvVar10->m_data).m_type == string) {
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_308,pvVar10);
            }
            else {
              fileops::generateJsonString((string *)&local_308,pvVar10,true);
            }
          }
          else {
            local_308._M_allocated_capacity = (size_type)&local_2f8;
            local_308._8_8_ = 0;
            local_2f8._M_local_buf[0] = '\0';
          }
          if ((undefined1 *)uVar23 != local_3c8) {
            operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
          }
          if (local_308._8_8_ != 0) {
            pCVar2 = ((callback_00.iface)->super_Interface).mCore;
            (*pCVar2->_vptr_Core[0x60])
                      (pCVar2,(ulong)(uint)((callback_00.iface)->super_Interface).handle.hid);
          }
          local_3c8._8_8_ =
               std::
               _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1320:20)>
               ::_M_invoke;
          local_3c8._0_8_ =
               std::
               _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1320:20)>
               ::_M_manager;
          loadTags((json *)pbVar12,
                   (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)&stack0xfffffffffffffc28);
          if ((code *)local_3c8._0_8_ != (code *)0x0) {
            (*(code *)local_3c8._0_8_)
                      ((string *)&stack0xfffffffffffffc28,(string *)&stack0xfffffffffffffc28,3);
          }
          local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
          local_328.field_2._M_allocated_capacity._4_2_ = 0x6563;
          local_328.field_2._M_allocated_capacity._0_4_ = 0x72756f73;
          local_328._M_string_length = 6;
          local_328.field_2._M_local_buf[6] = '\0';
          local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
          local_2a8.field_2._M_allocated_capacity._0_4_ = 0x67726174;
          local_2a8._M_string_length = 7;
          local_2a8.field_2._M_allocated_capacity._4_4_ = 0x737465;
          local_3b8._M_unused._M_object = auStack_3a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3b8,local_328._M_dataplus._M_p,
                     (undefined1 *)((long)&local_328.field_2 + 6));
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3b8,"_"
                );
          pbVar13 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_3b8,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
          uVar23 = (pbVar13->_M_dataplus)._M_p;
          paVar19 = &pbVar13->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar23 == paVar19) {
            local_3c8._0_8_ = paVar19->_M_allocated_capacity;
            local_3c8._8_8_ = *(long *)((long)&pbVar13->field_2 + 8);
            uVar23 = local_3c8;
          }
          else {
            local_3c8._0_8_ = paVar19->_M_allocated_capacity;
          }
          (pbVar13->_M_dataplus)._M_p = (pointer)paVar19;
          pbVar13->_M_string_length = 0;
          (pbVar13->field_2)._M_local_buf[0] = '\0';
          bVar6 = addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Translator>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_4_>
                            ((json *)pbVar12,(string *)&stack0xfffffffffffffc28,callback_00);
          if ((undefined1 *)uVar23 != local_3c8) {
            operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
          }
          if ((undefined1 *)local_3b8._M_unused._0_8_ != auStack_3a8) {
            operator_delete(local_3b8._M_unused._M_object,(ulong)(auStack_3a8._0_8_ + 1));
          }
          if (!bVar6) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_398,&local_328,&local_2a8);
            bVar6 = addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Translator>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_4_>
                              ((json *)pbVar12,(string *)&local_398,callback_00);
            if ((Filter *)local_398._M_allocated_capacity != (Filter *)local_388) {
              operator_delete((void *)local_398._M_allocated_capacity,(ulong)(local_388._0_8_ + 1));
            }
          }
          _Var5._M_p = local_2a8._M_dataplus._M_p;
          if (bVar6 == false) {
            iVar8 = toupper((int)*local_2a8._M_dataplus._M_p);
            *_Var5._M_p = (char)iVar8;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_388 + 0x10),&local_328,&local_2a8);
            addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Translator>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_4_>
                      ((json *)pbVar12,(string *)(local_388 + 0x10),callback_00);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._0_8_ != &local_368) {
              operator_delete((void *)local_378._0_8_,local_368._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p,
                            CONCAT44(local_2a8.field_2._M_allocated_capacity._4_4_,
                                     local_2a8.field_2._M_allocated_capacity._0_4_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != &local_328.field_2) {
            operator_delete(local_328._M_dataplus._M_p,
                            CONCAT17(local_328.field_2._M_local_buf[7],
                                     CONCAT16(local_328.field_2._M_local_buf[6],
                                              CONCAT24(local_328.field_2._M_allocated_capacity._4_2_
                                                       ,local_328.field_2._M_allocated_capacity.
                                                        _0_4_))) + 1);
          }
          local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
          local_328.field_2._M_allocated_capacity._0_4_ = 0x74736564;
          local_328.field_2._M_allocated_capacity._4_2_ = 0x6e69;
          local_328.field_2._M_local_buf[6] = 'a';
          local_328.field_2._7_4_ = 0x6e6f6974;
          local_328._M_string_length = 0xb;
          local_328.field_2._M_local_buf[0xb] = '\0';
          local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
          local_2c8.field_2._M_allocated_capacity._0_4_ = 0x67726174;
          local_2c8._M_string_length = 7;
          local_2c8.field_2._M_allocated_capacity._4_4_ = 0x737465;
          local_3b8._M_unused._M_object = auStack_3a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3b8,local_328._M_dataplus._M_p,
                     (undefined1 *)((long)&local_328.field_2 + 0xb));
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3b8,"_"
                );
          pbVar13 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_3b8,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
          uVar23 = (pbVar13->_M_dataplus)._M_p;
          paVar19 = &pbVar13->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar23 == paVar19) {
            local_3c8._0_8_ = paVar19->_M_allocated_capacity;
            local_3c8._8_8_ = *(long *)((long)&pbVar13->field_2 + 8);
            uVar23 = local_3c8;
          }
          else {
            local_3c8._0_8_ = paVar19->_M_allocated_capacity;
          }
          (pbVar13->_M_dataplus)._M_p = (pointer)paVar19;
          pbVar13->_M_string_length = 0;
          (pbVar13->field_2)._M_local_buf[0] = '\0';
          bVar6 = addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Translator>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_5_>
                            ((json *)pbVar12,(string *)&stack0xfffffffffffffc28,callback_00);
          if ((undefined1 *)uVar23 != local_3c8) {
            operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
          }
          if ((undefined1 *)local_3b8._M_unused._0_8_ != auStack_3a8) {
            operator_delete(local_3b8._M_unused._M_object,(ulong)(auStack_3a8._0_8_ + 1));
          }
          if (!bVar6) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_398,&local_328,&local_2c8);
            bVar6 = addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Translator>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_5_>
                              ((json *)pbVar12,(string *)&local_398,callback_00);
            if ((Filter *)local_398._M_allocated_capacity != (Filter *)local_388) {
              operator_delete((void *)local_398._M_allocated_capacity,(ulong)(local_388._0_8_ + 1));
            }
          }
          _Var5._M_p = local_2c8._M_dataplus._M_p;
          if (bVar6 == false) {
            iVar8 = toupper((int)*local_2c8._M_dataplus._M_p);
            *_Var5._M_p = (char)iVar8;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_388 + 0x10),&local_328,&local_2c8);
            addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Translator>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_5_>
                      ((json *)pbVar12,(string *)(local_388 + 0x10),callback_00);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._0_8_ != &local_368) {
              operator_delete((void *)local_378._0_8_,local_368._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p,
                            CONCAT44(local_2c8.field_2._M_allocated_capacity._4_4_,
                                     local_2c8.field_2._M_allocated_capacity._0_4_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_328._M_dataplus._M_p != &local_328.field_2) {
            operator_delete(local_328._M_dataplus._M_p,
                            CONCAT17(local_328.field_2._M_local_buf[7],
                                     CONCAT16(local_328.field_2._M_local_buf[6],
                                              CONCAT24(local_328.field_2._M_allocated_capacity._4_2_
                                                       ,local_328.field_2._M_allocated_capacity.
                                                        _0_4_))) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._M_allocated_capacity != &local_2f8) {
            operator_delete((void *)local_308._M_allocated_capacity,
                            CONCAT71(local_2f8._M_allocated_capacity._1_7_,local_2f8._M_local_buf[0]
                                    ) + 1);
          }
          local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"source","");
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"endpoints","");
          local_3b8._M_unused._M_object = auStack_3a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3b8,local_358._M_dataplus._M_p,
                     local_358._M_string_length + local_358._M_dataplus._M_p);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3b8,"_"
                );
          pbVar13 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_3b8,local_130._M_dataplus._M_p,local_130._M_string_length);
          uVar23 = (pbVar13->_M_dataplus)._M_p;
          paVar19 = &pbVar13->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar23 == paVar19) {
            local_3c8._0_8_ = paVar19->_M_allocated_capacity;
            local_3c8._8_8_ = *(long *)((long)&pbVar13->field_2 + 8);
            uVar23 = local_3c8;
          }
          else {
            local_3c8._0_8_ = paVar19->_M_allocated_capacity;
          }
          (pbVar13->_M_dataplus)._M_p = (pointer)paVar19;
          pbVar13->_M_string_length = 0;
          (pbVar13->field_2)._M_local_buf[0] = '\0';
          bVar6 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__6>
                            ((json *)pbVar12,(string *)&stack0xfffffffffffffc28,
                             (anon_class_8_1_36d583d8)callback_00.iface);
          if ((undefined1 *)uVar23 != local_3c8) {
            operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
          }
          if ((undefined1 *)local_3b8._M_unused._0_8_ != auStack_3a8) {
            operator_delete(local_3b8._M_unused._M_object,(ulong)(auStack_3a8._0_8_ + 1));
          }
          if (!bVar6) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_398,&local_358,&local_130);
            bVar6 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__6>
                              ((json *)pbVar12,(string *)&local_398,
                               (anon_class_8_1_36d583d8)callback_00.iface);
            if ((Filter *)local_398._M_allocated_capacity != (Filter *)local_388) {
              operator_delete((void *)local_398._M_allocated_capacity,(ulong)(local_388._0_8_ + 1));
            }
          }
          _Var5._M_p = local_130._M_dataplus._M_p;
          if (bVar6 == false) {
            iVar8 = toupper((int)*local_130._M_dataplus._M_p);
            *_Var5._M_p = (char)iVar8;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_388 + 0x10),&local_358,&local_130);
            addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__6>
                      ((json *)pbVar12,(string *)(local_388 + 0x10),
                       (anon_class_8_1_36d583d8)callback_00.iface);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._0_8_ != &local_368) {
              operator_delete((void *)local_378._0_8_,local_368._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_dataplus._M_p != &local_358.field_2) {
            operator_delete(local_358._M_dataplus._M_p,
                            CONCAT26(local_358.field_2._M_allocated_capacity._6_2_,
                                     CONCAT15(local_358.field_2._M_local_buf[5],
                                              CONCAT14(local_358.field_2._M_local_buf[4],
                                                       local_358.field_2._M_allocated_capacity._0_4_
                                                      ))) + 1);
          }
          local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"destination","");
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"endpoints","");
          local_3b8._M_unused._M_object = auStack_3a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3b8,local_358._M_dataplus._M_p,
                     local_358._M_string_length + local_358._M_dataplus._M_p);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3b8,"_"
                );
          pbVar13 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_3b8,local_150._M_dataplus._M_p,local_150._M_string_length);
          uVar23 = (pbVar13->_M_dataplus)._M_p;
          paVar19 = &pbVar13->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar23 == paVar19) {
            local_3c8._0_8_ = paVar19->_M_allocated_capacity;
            local_3c8._8_8_ = *(long *)((long)&pbVar13->field_2 + 8);
            uVar23 = local_3c8;
          }
          else {
            local_3c8._0_8_ = paVar19->_M_allocated_capacity;
          }
          (pbVar13->_M_dataplus)._M_p = (pointer)paVar19;
          pbVar13->_M_string_length = 0;
          (pbVar13->field_2)._M_local_buf[0] = '\0';
          bVar6 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__7>
                            ((json *)pbVar12,(string *)&stack0xfffffffffffffc28,
                             (anon_class_8_1_36d583d8)callback_00.iface);
          if ((undefined1 *)uVar23 != local_3c8) {
            operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
          }
          if ((undefined1 *)local_3b8._M_unused._0_8_ != auStack_3a8) {
            operator_delete(local_3b8._M_unused._M_object,(ulong)(auStack_3a8._0_8_ + 1));
          }
          if (!bVar6) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_398,&local_358,&local_150);
            bVar6 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__7>
                              ((json *)pbVar12,(string *)&local_398,
                               (anon_class_8_1_36d583d8)callback_00.iface);
            if ((Filter *)local_398._M_allocated_capacity != (Filter *)local_388) {
              operator_delete((void *)local_398._M_allocated_capacity,(ulong)(local_388._0_8_ + 1));
            }
          }
          _Var5._M_p = local_150._M_dataplus._M_p;
          if (bVar6 == false) {
            iVar8 = toupper((int)*local_150._M_dataplus._M_p);
            *_Var5._M_p = (char)iVar8;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_388 + 0x10),&local_358,&local_150);
            addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__7>
                      ((json *)pbVar12,(string *)(local_388 + 0x10),
                       (anon_class_8_1_36d583d8)callback_00.iface);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._0_8_ != &local_368) {
              operator_delete((void *)local_378._0_8_,local_368._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_dataplus._M_p != &local_358.field_2) {
            operator_delete(local_358._M_dataplus._M_p,
                            CONCAT26(local_358.field_2._M_allocated_capacity._6_2_,
                                     CONCAT15(local_358.field_2._M_local_buf[5],
                                              CONCAT14(local_358.field_2._M_local_buf[4],
                                                       local_358.field_2._M_allocated_capacity._0_4_
                                                      ))) + 1);
          }
          local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"source","");
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"publications","");
          local_3b8._M_unused._M_object = auStack_3a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3b8,local_358._M_dataplus._M_p,
                     local_358._M_string_length + local_358._M_dataplus._M_p);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3b8,"_"
                );
          pbVar13 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_3b8,local_170._M_dataplus._M_p,local_170._M_string_length);
          uVar23 = (pbVar13->_M_dataplus)._M_p;
          paVar19 = &pbVar13->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar23 == paVar19) {
            local_3c8._0_8_ = paVar19->_M_allocated_capacity;
            local_3c8._8_8_ = *(long *)((long)&pbVar13->field_2 + 8);
            uVar23 = local_3c8;
          }
          else {
            local_3c8._0_8_ = paVar19->_M_allocated_capacity;
          }
          (pbVar13->_M_dataplus)._M_p = (pointer)paVar19;
          pbVar13->_M_string_length = 0;
          (pbVar13->field_2)._M_local_buf[0] = '\0';
          bVar6 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__8>
                            ((json *)pbVar12,(string *)&stack0xfffffffffffffc28,
                             (anon_class_8_1_36d583d8)callback_00.iface);
          if ((undefined1 *)uVar23 != local_3c8) {
            operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
          }
          if ((undefined1 *)local_3b8._M_unused._0_8_ != auStack_3a8) {
            operator_delete(local_3b8._M_unused._M_object,(ulong)(auStack_3a8._0_8_ + 1));
          }
          if (!bVar6) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_398,&local_358,&local_170);
            bVar6 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__8>
                              ((json *)pbVar12,(string *)&local_398,
                               (anon_class_8_1_36d583d8)callback_00.iface);
            if ((Filter *)local_398._M_allocated_capacity != (Filter *)local_388) {
              operator_delete((void *)local_398._M_allocated_capacity,(ulong)(local_388._0_8_ + 1));
            }
          }
          _Var5._M_p = local_170._M_dataplus._M_p;
          if (bVar6 == false) {
            iVar8 = toupper((int)*local_170._M_dataplus._M_p);
            *_Var5._M_p = (char)iVar8;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_388 + 0x10),&local_358,&local_170);
            addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__8>
                      ((json *)pbVar12,(string *)(local_388 + 0x10),
                       (anon_class_8_1_36d583d8)callback_00.iface);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._0_8_ != &local_368) {
              operator_delete((void *)local_378._0_8_,local_368._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_dataplus._M_p != &local_358.field_2) {
            operator_delete(local_358._M_dataplus._M_p,
                            CONCAT26(local_358.field_2._M_allocated_capacity._6_2_,
                                     CONCAT15(local_358.field_2._M_local_buf[5],
                                              CONCAT14(local_358.field_2._M_local_buf[4],
                                                       local_358.field_2._M_allocated_capacity._0_4_
                                                      ))) + 1);
          }
          local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"destination","");
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"inputs","");
          local_3b8._M_unused._M_object = auStack_3a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3b8,local_358._M_dataplus._M_p,
                     local_358._M_string_length + local_358._M_dataplus._M_p);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3b8,"_"
                );
          pbVar13 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_3b8,local_190._M_dataplus._M_p,local_190._M_string_length);
          uVar23 = (pbVar13->_M_dataplus)._M_p;
          paVar19 = &pbVar13->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar23 == paVar19) {
            local_3c8._0_8_ = paVar19->_M_allocated_capacity;
            local_3c8._8_8_ = *(long *)((long)&pbVar13->field_2 + 8);
            uVar23 = local_3c8;
          }
          else {
            local_3c8._0_8_ = paVar19->_M_allocated_capacity;
          }
          (pbVar13->_M_dataplus)._M_p = (pointer)paVar19;
          pbVar13->_M_string_length = 0;
          (pbVar13->field_2)._M_local_buf[0] = '\0';
          bVar6 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__9>
                            ((json *)pbVar12,(string *)&stack0xfffffffffffffc28,
                             (anon_class_8_1_36d583d8)callback_00.iface);
          if ((undefined1 *)uVar23 != local_3c8) {
            operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
          }
          if ((undefined1 *)local_3b8._M_unused._0_8_ != auStack_3a8) {
            operator_delete(local_3b8._M_unused._M_object,(ulong)(auStack_3a8._0_8_ + 1));
          }
          if (!bVar6) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_398,&local_358,&local_190);
            bVar6 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__9>
                              ((json *)pbVar12,(string *)&local_398,
                               (anon_class_8_1_36d583d8)callback_00.iface);
            if ((Filter *)local_398._M_allocated_capacity != (Filter *)local_388) {
              operator_delete((void *)local_398._M_allocated_capacity,(ulong)(local_388._0_8_ + 1));
            }
          }
          _Var5._M_p = local_190._M_dataplus._M_p;
          if (bVar6 == false) {
            iVar8 = toupper((int)*local_190._M_dataplus._M_p);
            *_Var5._M_p = (char)iVar8;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_388 + 0x10),&local_358,&local_190);
            addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__9>
                      ((json *)pbVar12,(string *)(local_388 + 0x10),
                       (anon_class_8_1_36d583d8)callback_00.iface);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._0_8_ != &local_368) {
              operator_delete((void *)local_378._0_8_,local_368._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_dataplus._M_p != &local_358.field_2) {
            operator_delete(local_358._M_dataplus._M_p,
                            CONCAT26(local_358.field_2._M_allocated_capacity._6_2_,
                                     CONCAT15(local_358.field_2._M_local_buf[5],
                                              CONCAT14(local_358.field_2._M_local_buf[4],
                                                       local_358.field_2._M_allocated_capacity._0_4_
                                                      ))) + 1);
          }
          local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"source","");
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"filters","");
          local_3b8._M_unused._M_object = auStack_3a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3b8,local_358._M_dataplus._M_p,
                     local_358._M_string_length + local_358._M_dataplus._M_p);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3b8,"_"
                );
          pbVar13 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_3b8,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
          uVar23 = (pbVar13->_M_dataplus)._M_p;
          paVar19 = &pbVar13->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar23 == paVar19) {
            local_3c8._0_8_ = paVar19->_M_allocated_capacity;
            local_3c8._8_8_ = *(long *)((long)&pbVar13->field_2 + 8);
            uVar23 = local_3c8;
          }
          else {
            local_3c8._0_8_ = paVar19->_M_allocated_capacity;
          }
          (pbVar13->_M_dataplus)._M_p = (pointer)paVar19;
          pbVar13->_M_string_length = 0;
          (pbVar13->field_2)._M_local_buf[0] = '\0';
          bVar6 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__10>
                            ((json *)pbVar12,(string *)&stack0xfffffffffffffc28,
                             (anon_class_8_1_36d583d8)callback_00.iface);
          if ((undefined1 *)uVar23 != local_3c8) {
            operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
          }
          if ((undefined1 *)local_3b8._M_unused._0_8_ != auStack_3a8) {
            operator_delete(local_3b8._M_unused._M_object,(ulong)(auStack_3a8._0_8_ + 1));
          }
          if (!bVar6) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_398,&local_358,&local_1b0);
            bVar6 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__10>
                              ((json *)pbVar12,(string *)&local_398,
                               (anon_class_8_1_36d583d8)callback_00.iface);
            if ((Filter *)local_398._M_allocated_capacity != (Filter *)local_388) {
              operator_delete((void *)local_398._M_allocated_capacity,(ulong)(local_388._0_8_ + 1));
            }
          }
          _Var5._M_p = local_1b0._M_dataplus._M_p;
          if (bVar6 == false) {
            iVar8 = toupper((int)*local_1b0._M_dataplus._M_p);
            *_Var5._M_p = (char)iVar8;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_388 + 0x10),&local_358,&local_1b0);
            addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__10>
                      ((json *)pbVar12,(string *)(local_388 + 0x10),
                       (anon_class_8_1_36d583d8)callback_00.iface);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._0_8_ != &local_368) {
              operator_delete((void *)local_378._0_8_,local_368._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_dataplus._M_p != &local_358.field_2) {
            operator_delete(local_358._M_dataplus._M_p,
                            CONCAT26(local_358.field_2._M_allocated_capacity._6_2_,
                                     CONCAT15(local_358.field_2._M_local_buf[5],
                                              CONCAT14(local_358.field_2._M_local_buf[4],
                                                       local_358.field_2._M_allocated_capacity._0_4_
                                                      ))) + 1);
          }
          local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"destination","");
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"filters","");
          local_3b8._M_unused._M_object = auStack_3a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3b8,local_358._M_dataplus._M_p,
                     local_358._M_string_length + local_358._M_dataplus._M_p);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3b8,"_"
                );
          pbVar13 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_3b8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
          uVar22 = (pbVar13->_M_dataplus)._M_p;
          paVar19 = &pbVar13->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar22 == paVar19) {
            local_3c8._0_8_ = paVar19->_M_allocated_capacity;
            local_3c8._8_8_ = *(long *)((long)&pbVar13->field_2 + 8);
            uVar22 = local_3c8;
          }
          else {
            local_3c8._0_8_ = paVar19->_M_allocated_capacity;
          }
          uStack_3d0 = pbVar13->_M_string_length;
          (pbVar13->_M_dataplus)._M_p = (pointer)paVar19;
          pbVar13->_M_string_length = 0;
          (pbVar13->field_2)._M_local_buf[0] = '\0';
          bVar6 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__11>
                            ((json *)pbVar12,(string *)&stack0xfffffffffffffc28,
                             (anon_class_8_1_36d583d8)callback_00.iface);
          if ((undefined1 *)uVar22 != local_3c8) {
            operator_delete((void *)uVar22,local_3c8._0_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b8._M_unused._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)auStack_3a8) {
            operator_delete(local_3b8._M_unused._M_object,(ulong)(auStack_3a8._0_8_ + 1));
          }
          if (!bVar6) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_398,&local_358,&local_1d0);
            bVar6 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__11>
                              ((json *)pbVar12,(string *)&local_398,
                               (anon_class_8_1_36d583d8)callback_00.iface);
            if ((Filter *)local_398._M_allocated_capacity != (Filter *)local_388) {
              operator_delete((void *)local_398._M_allocated_capacity,(ulong)(local_388._0_8_ + 1));
            }
          }
          _Var5._M_p = local_1d0._M_dataplus._M_p;
          if (bVar6 == false) {
            iVar8 = toupper((int)*local_1d0._M_dataplus._M_p);
            *_Var5._M_p = (char)iVar8;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_388 + 0x10),&local_358,&local_1d0);
            addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__11>
                      ((json *)pbVar12,(string *)(local_388 + 0x10),
                       (anon_class_8_1_36d583d8)callback_00.iface);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._0_8_ != &local_368) {
              operator_delete((void *)local_378._0_8_,local_368._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_dataplus._M_p != &local_358.field_2) {
            operator_delete(local_358._M_dataplus._M_p,
                            CONCAT26(local_358.field_2._M_allocated_capacity._6_2_,
                                     CONCAT15(local_358.field_2._M_local_buf[5],
                                              CONCAT14(local_358.field_2._M_local_buf[4],
                                                       local_358.field_2._M_allocated_capacity._0_4_
                                                      ))) + 1);
          }
          if (*pbVar12 ==
              (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               )0x1) {
            bVar6 = local_338->strictConfigChecking;
            cVar11 = std::
                     _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                     ::_M_find_tr<char[11],void>
                               (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                  **)(pbVar12 + 8),(char (*) [11])"properties");
            if (cVar11._M_node != (_Base_ptr)(*(long *)(pbVar12 + 8) + 8)) {
              paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)nlohmann::json_abi_v3_11_3::
                           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           ::operator[]<char_const>(pbVar12,"properties");
              if ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   )paVar14->_M_local_buf[0] ==
                  (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   )0x1) {
                cVar11 = std::
                         _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                         ::_M_find_tr<char[5],void>
                                   (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                      **)(paVar14->_M_local_buf + 8),(char (*) [5])0x42591b);
                if (((cVar11._M_node !=
                      (_Base_ptr)
                      (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                         **)(paVar14->_M_local_buf + 8) + 8)) &&
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      )paVar14->_M_local_buf[0] ==
                     (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      )0x1)) &&
                   (cVar11 = std::
                             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                             ::_M_find_tr<char[6],void>
                                       (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                          **)(paVar14->_M_local_buf + 8),(char (*) [6])0x43c869),
                   cVar11._M_node != (_Base_ptr)(*(long *)(paVar14->_M_local_buf + 8) + 8))) {
                  pvVar10 = nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            ::operator[]<char_const>
                                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                        *)paVar14->_M_local_buf,"value");
                  if ((byte)((pvVar10->m_data).m_type - number_integer) < 3) {
                    pvVar10 = nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              ::operator[]<char_const>
                                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                          *)paVar14->_M_local_buf,"name");
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::
                    get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                              ((string *)&stack0xfffffffffffffc28,pvVar10);
                    uVar23 = uVar22;
                    pvVar10 = nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              ::operator[]<char_const>
                                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                          *)paVar14->_M_local_buf,"value");
                    local_3b8._M_unused._M_object =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
                    nlohmann::json_abi_v3_11_3::detail::
                    get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_double,_0>
                              (pvVar10,(double *)&local_3b8);
                    (*((callback_00.iface)->super_Interface)._vptr_Interface[5])
                              ((int)local_3b8._M_unused._M_member_pointer,callback_00.iface,
                               uStack_3d0,uVar22);
                  }
                  else {
                    pvVar10 = nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              ::operator[]<char_const>
                                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                          *)paVar14->_M_local_buf,"name");
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::
                    get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                              ((string *)&stack0xfffffffffffffc28,pvVar10);
                    uVar23 = uVar22;
                    pvVar10 = nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              ::operator[]<char_const>
                                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                          *)paVar14->_M_local_buf,"value");
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::
                    get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                              (&local_3b8,pvVar10);
                    (*((callback_00.iface)->super_Interface)._vptr_Interface[6])
                              (callback_00.iface,uStack_3d0,uVar22,local_3b8._8_8_,
                               local_3b8._M_unused._M_object);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3b8._M_unused._0_8_ !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)auStack_3a8) {
                      operator_delete(local_3b8._M_unused._M_object,(ulong)(auStack_3a8._0_8_ + 1));
                    }
                  }
                  goto LAB_00230f75;
                }
              }
              else if ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        )paVar14->_M_local_buf[0] ==
                       (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        )0x2) {
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::cbegin((const_iterator *)&stack0xfffffffffffffc28,
                         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)paVar14);
                auStack_3a8._8_8_ = (code *)0x8000000000000000;
                auStack_3a8._0_8_ = (code *)0x0;
                local_3b8._8_8_ = (atomic<helics::Federate::Modes> *)0x0;
                if ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     )paVar14->_M_local_buf[0] ==
                    (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     )0x2) {
                  auStack_3a8._0_8_ = *(long *)(*(long *)(paVar14->_M_local_buf + 8) + 8);
                }
                else if ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          )paVar14->_M_local_buf[0] ==
                         (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          )0x1) {
                  local_3b8._8_8_ = *(long *)(paVar14->_M_local_buf + 8) + 8;
                }
                else {
                  auStack_3a8._8_8_ = (code *)0x1;
                }
                local_3b8._M_unused._0_8_ = (undefined8)paVar14;
                bVar7 = nlohmann::json_abi_v3_11_3::detail::
                        iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        ::
                        operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                                  ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                    *)&stack0xfffffffffffffc28,
                                   (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                    *)&local_3b8);
                while (bVar7 == false) {
                  pbVar12 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)nlohmann::json_abi_v3_11_3::detail::
                               iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                            *)&stack0xfffffffffffffc28);
                  if (*pbVar12 ==
                      (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       )0x1) {
                    cVar11 = std::
                             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                             ::_M_find_tr<char[5],void>
                                       (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                          **)(pbVar12 + 8),(char (*) [5])0x42591b);
                    if (((cVar11._M_node ==
                          (_Base_ptr)
                          (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                             **)(pbVar12 + 8) + 8)) ||
                        (*pbVar12 !=
                         (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          )0x1)) ||
                       (cVar11 = std::
                                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                 ::_M_find_tr<char[6],void>
                                           (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                              **)(pbVar12 + 8),(char (*) [6])0x43c869),
                       cVar11._M_node == (_Base_ptr)(*(long *)(pbVar12 + 8) + 8)))
                    goto LAB_00232af5;
                    pvVar10 = nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              ::operator[]<char_const>(pbVar12,"value");
                    if ((byte)((pvVar10->m_data).m_type - number_integer) < 3) {
                      pvVar10 = nlohmann::json_abi_v3_11_3::
                                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                ::operator[]<char_const>(pbVar12,"name");
                      nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::
                      get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                (&local_398,pvVar10);
                      uVar24 = local_398._8_8_;
                      uVar23 = local_398._M_allocated_capacity;
                      pvVar10 = nlohmann::json_abi_v3_11_3::
                                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                ::operator[]<char_const>(pbVar12,"value");
                      local_378._0_8_ =
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)0x0;
                      nlohmann::json_abi_v3_11_3::detail::
                      get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_double,_0>
                                (pvVar10,(double *)(local_388 + 0x10));
                      (*((callback_00.iface)->super_Interface)._vptr_Interface[5])
                                ((int)local_378._0_8_,callback_00.iface,uVar24,uVar23);
                      if ((Filter *)local_398._M_allocated_capacity != (Filter *)local_388) {
                        operator_delete((void *)local_398._M_allocated_capacity,
                                        (ulong)(local_388._0_8_ + 1));
                      }
                    }
                    else {
                      pvVar10 = nlohmann::json_abi_v3_11_3::
                                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                ::operator[]<char_const>(pbVar12,"name");
                      nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::
                      get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                (&local_398,pvVar10);
                      uVar24 = local_398._8_8_;
                      uVar23 = local_398._M_allocated_capacity;
                      pvVar10 = nlohmann::json_abi_v3_11_3::
                                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                ::operator[]<char_const>(pbVar12,"value");
                      nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::
                      get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                                (local_388 + 0x10,pvVar10);
                      (*((callback_00.iface)->super_Interface)._vptr_Interface[6])
                                (callback_00.iface,uVar24,uVar23,local_378._8_8_,local_378._0_8_);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_378._0_8_ != &local_368) {
                        operator_delete((void *)local_378._0_8_,local_368._M_allocated_capacity + 1)
                        ;
                      }
                      if ((Filter *)local_398._M_allocated_capacity != (Filter *)local_388) {
                        operator_delete((void *)local_398._M_allocated_capacity,
                                        (ulong)(local_388._0_8_ + 1));
                      }
                    }
                  }
                  else {
LAB_00232af5:
                    if (bVar6 != false) goto LAB_00232cf4;
                    message_06._M_str = "interface properties require \"name\" and \"value\" fields"
                    ;
                    message_06._M_len = 0x36;
                    logMessage(local_338,3,message_06);
                  }
                  if (*(char *)uVar22 == '\x02') {
                    local_3c8._0_8_ = local_3c8._0_8_ + 0x10;
                  }
                  else if (*(char *)uVar22 == '\x01') {
                    uStack_3d0 = std::_Rb_tree_increment((_Rb_tree_node_base *)uStack_3d0);
                  }
                  else {
                    local_3c8._8_8_ = local_3c8._8_8_ + 1;
                  }
                  bVar7 = nlohmann::json_abi_v3_11_3::detail::
                          iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          ::
                          operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                                    ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                      *)&stack0xfffffffffffffc28,
                                     (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                      *)&local_3b8);
                }
                goto LAB_00232889;
              }
              if (bVar6 != false) {
LAB_00232cf4:
                message_08._M_str = "interface properties require \"name\" and \"value\" fields";
                message_08._M_len = 0x36;
                logMessage(local_338,0,message_08);
                pHVar17 = (HelicsException *)__cxa_allocate_exception(0x28);
                message_00._M_str = "interface properties require \"name\" and \"value\" fields";
                message_00._M_len = 0x36;
                HelicsException::HelicsException(pHVar17,message_00);
                *(undefined ***)pHVar17 = &PTR__HelicsException_00522bc0;
                __cxa_throw(pHVar17,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
              }
              message_05._M_str = "interface properties require \"name\" and \"value\" fields";
              message_05._M_len = 0x36;
              logMessage(local_338,3,message_05);
            }
          }
        }
LAB_00232889:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,
                          CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                                   local_1f0.field_2._M_local_buf[0]) + 1);
        }
        this = local_338;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,
                          CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                   local_260.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,
                          CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                                   local_2e8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,
                          CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                   local_288.field_2._M_local_buf[0]) + 1);
        }
        vVar1 = ((local_218.m_object)->m_data).m_type;
        if (vVar1 == array) {
          local_218.m_it.array_iterator._M_current = local_218.m_it.array_iterator._M_current + 1;
        }
        else if (vVar1 == object) {
          local_218.m_it.object_iterator._M_node =
               (_Base_ptr)std::_Rb_tree_increment(local_218.m_it.object_iterator._M_node);
        }
        else {
          local_218.m_it.primitive_iterator.m_it = local_218.m_it.primitive_iterator.m_it + 1;
        }
        bVar6 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::
                operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                          (&local_218,
                           (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)&local_240);
      } while (!bVar6);
    }
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_80,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_268);
  uVar23 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc28,"globals","");
  local_3b8._8_8_ = 0;
  auStack_3a8._8_8_ =
       std::
       _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1547:39)>
       ::_M_invoke;
  auStack_3a8._0_8_ =
       std::
       _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1547:39)>
       ::_M_manager;
  local_3b8._M_unused._0_8_ = (undefined8)this;
  arrayPairProcess((json *)&local_80,(string *)&stack0xfffffffffffffc28,
                   (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)&local_3b8);
  if ((code *)auStack_3a8._0_8_ != (code *)0x0) {
    (*(code *)auStack_3a8._0_8_)(&local_3b8,&local_3b8,3);
  }
  if ((undefined1 *)uVar23 != local_3c8) {
    operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_80);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_90,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_268);
  uVar23 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffc28,"aliases","");
  local_3b8._8_8_ = 0;
  auStack_3a8._8_8_ =
       std::
       _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1550:39)>
       ::_M_invoke;
  auStack_3a8._0_8_ =
       std::
       _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1550:39)>
       ::_M_manager;
  local_3b8._M_unused._0_8_ = (undefined8)this;
  arrayPairProcess((json *)&local_90,(string *)&stack0xfffffffffffffc28,
                   (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)&local_3b8);
  if ((code *)auStack_3a8._0_8_ != (code *)0x0) {
    (*(code *)auStack_3a8._0_8_)(&local_3b8,&local_3b8,3);
  }
  if ((undefined1 *)uVar23 != local_3c8) {
    operator_delete((void *)uVar23,local_3c8._0_8_ + 1);
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_90);
  pbVar12 = local_268;
  local_3c8._8_8_ =
       std::
       _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1554:20)>
       ::_M_invoke;
  local_3c8._0_8_ =
       std::
       _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1554:20)>
       ::_M_manager;
  loadTags((json *)local_268,
           (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
            *)&stack0xfffffffffffffc28);
  if ((code *)local_3c8._0_8_ != (code *)0x0) {
    (*(code *)local_3c8._0_8_)(&stack0xfffffffffffffc28,&stack0xfffffffffffffc28,3);
  }
  if ((*pbVar12 ==
       (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        )0x1) &&
     (cVar11 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
               ::_M_find_tr<char[7],void>
                         (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                            **)(pbVar12 + 8),(char (*) [7])0x425f1c),
     cVar11._M_node != (_Base_ptr)(*(long *)(pbVar12 + 8) + 8))) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::operator[]<char_const>(pbVar12,"helics");
    registerConnectorInterfacesJsonDetail(this,(JsonBuffer *)&stack0xfffffffffffffc28);
  }
  if (((*pbVar12 ==
        (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         )0x1) &&
      (cVar11 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                ::_M_find_tr<char[21],void>
                          (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                             **)(pbVar12 + 8),(char (*) [21])"potential_interfaces"),
      cVar11._M_node != (_Base_ptr)(*(long *)(pbVar12 + 8) + 8))) ||
     ((*pbVar12 ==
       (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
        )0x1 && (cVar15 = std::
                          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                          ::_M_find_tr<char[30],void>
                                    (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                       **)(pbVar12 + 8),
                                     (char (*) [30])"potential_interface_templates"),
                cVar15._M_node != (_Base_ptr)(*(long *)(pbVar12 + 8) + 8))))) {
    if ((this->potManager)._M_t.
        super___uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
        ._M_t.
        super__Tuple_impl<0UL,_helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
        .super__Head_base<0UL,_helics::PotentialInterfacesManager_*,_false>._M_head_impl ==
        (PotentialInterfacesManager *)0x0) {
      pCVar2 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      this_01._M_head_impl = (PotentialInterfacesManager *)operator_new(200);
      PotentialInterfacesManager::PotentialInterfacesManager(this_01._M_head_impl,pCVar2,this);
      this_00 = &this->potManager;
      uVar23 = (PotentialInterfacesManager *)0x0;
      __ptr._M_head_impl =
           (this_00->_M_t).
           super___uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
           .super__Head_base<0UL,_helics::PotentialInterfacesManager_*,_false>._M_head_impl;
      (this_00->_M_t).
      super___uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
      ._M_t.
      super__Tuple_impl<0UL,_helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
      .super__Head_base<0UL,_helics::PotentialInterfacesManager_*,_false>._M_head_impl =
           this_01._M_head_impl;
      if (__ptr._M_head_impl != (PotentialInterfacesManager *)0x0) {
        std::default_delete<helics::PotentialInterfacesManager>::operator()
                  ((default_delete<helics::PotentialInterfacesManager> *)this_00,__ptr._M_head_impl)
        ;
      }
      pbVar12 = local_268;
      if ((PotentialInterfacesManager *)uVar23 != (PotentialInterfacesManager *)0x0) {
        std::default_delete<helics::PotentialInterfacesManager>::operator()
                  ((default_delete<helics::PotentialInterfacesManager> *)&stack0xfffffffffffffc28,
                   (PotentialInterfacesManager *)uVar23);
      }
    }
    PotentialInterfacesManager::loadPotentialInterfaces
              ((this->potManager)._M_t.
               super___uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
               .super__Head_base<0UL,_helics::PotentialInterfacesManager_*,_false>._M_head_impl,
               (json *)pbVar12);
    this->hasPotentialInterfaces = true;
  }
  return;
}

Assistant:

void Federate::registerConnectorInterfacesJsonDetail(const fileops::JsonBuffer& jsonBuffer)
{
    using fileops::getOrDefault;
    const auto& json = jsonBuffer.json();
    bool defaultGlobal = false;
    fileops::replaceIfMember(json, "defaultglobal", defaultGlobal);

    const nlohmann::json& iface = (json.contains("interfaces")) ? json["interfaces"] : json;

    if (iface.contains("filters")) {
        for (const auto& filt : iface["filters"]) {
            const std::string key = getOrDefault(filt, "name", emptyStr);
            const std::string inputType = getOrDefault(filt, "inputType", emptyStr);
            const std::string outputType = getOrDefault(filt, "outputType", emptyStr);
            const bool cloningFlag = getOrDefault(filt, "cloning", false);
            const bool useTypes = !((inputType.empty()) && (outputType.empty()));
            const bool global = fileops::getOrDefault(filt, "global", defaultGlobal);
            const std::string operation =
                getOrDefault(filt,
                             "operation",
                             (cloningFlag) ? std::string("clone") : std::string("custom"));

            auto opType = filterTypeFromString(operation);
            if (!checkValidFilterType(useTypes, opType, operation)) {
                continue;
            }
            auto& filter =
                generateFilter(this, global, cloningFlag, key, opType, inputType, outputType);
            loadOptions(this, filt, filter);

            addTargetVariations(filt, "source", "endpoints", [&filter](const std::string& target) {
                filter.addSourceTarget(target);
            });
            addTargetVariations(filt,
                                "destination",
                                "endpoints",
                                [&filter](const std::string& target) {
                                    filter.addDestinationTarget(target);
                                });

            if (cloningFlag) {
                addTargets(filt, "delivery", [&filter](const std::string& target) {
                    static_cast<CloningFilter&>(filter).addDeliveryEndpoint(target);
                });
            }

            loadPropertiesJson(this, filter, filt, strictConfigChecking);
        }
    }
    if (iface.contains("translators")) {
        for (const auto& trans : iface["translators"]) {
            const std::string key = getOrDefault(trans, "name", emptyStr);

            std::string ttype = getOrDefault(trans, "type", std::string("custom"));
            auto opType = translatorTypeFromString(ttype);
            auto etype = fileops::getOrDefault(trans, "endpointtype", emptyStr);
            auto units = fileops::getOrDefault(trans, "unit", emptyStr);
            fileops::replaceIfMember(trans, "units", units);
            const bool global = fileops::getOrDefault(trans, "global", defaultGlobal);

            if (opType == TranslatorTypes::UNRECOGNIZED) {
                if (strictConfigChecking) {
                    const std::string emessage =
                        fmt::format("unrecognized translator type:{}", ttype);
                    logMessage(HELICS_LOG_LEVEL_ERROR, emessage);

                    throw(InvalidParameter(emessage));
                }
                logMessage(HELICS_LOG_LEVEL_WARNING,
                           fmt::format("unrecognized translator operation:{}", ttype));
                continue;
            }
            auto& translator = generateTranslator(this, global, key, opType, etype, units);
            loadOptions(this, trans, translator);

            addTargetVariations(trans,
                                "source",
                                "endpoints",
                                [&translator](const std::string& target) {
                                    translator.addSourceEndpoint(target);
                                });
            addTargetVariations(trans,
                                "destination",
                                "endpoints",
                                [&translator](const std::string& target) {
                                    translator.addDestinationEndpoint(target);
                                });
            addTargetVariations(trans,
                                "source",
                                "publications",
                                [&translator](const std::string& target) {
                                    translator.addPublication(target);
                                });
            addTargetVariations(trans,
                                "destination",
                                "inputs",
                                [&translator](const std::string& target) {
                                    translator.addInputTarget(target);
                                });
            addTargetVariations(trans,
                                "source",
                                "filters",
                                [&translator](const std::string& target) {
                                    translator.addSourceFilter(target);
                                });
            addTargetVariations(trans,
                                "destination",
                                "filters",
                                [&translator](const std::string& target) {
                                    translator.addDestinationFilter(target);
                                });
            loadPropertiesJson(this, translator, trans, strictConfigChecking);
        }
    }
    arrayPairProcess(json, "globals", [this](std::string_view key, std::string_view val) {
        setGlobal(key, val);
    });
    arrayPairProcess(json, "aliases", [this](std::string_view key, std::string_view val) {
        addAlias(key, val);
    });

    loadTags(json, [this](std::string_view tagname, std::string_view tagvalue) {
        this->setTag(tagname, tagvalue);
    });
    if (json.contains("helics")) {
        registerConnectorInterfacesJsonDetail(fileops::JsonBuffer(json["helics"]));
    }

    if (json.contains("potential_interfaces") || json.contains("potential_interface_templates")) {
        if (!potManager) {
            potManager = std::make_unique<PotentialInterfacesManager>(coreObject.get(), this);
        }
        potManager->loadPotentialInterfaces(json);
        hasPotentialInterfaces = true;
    }
}